

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx2::CurveNiMBIntersectorK<4,8>::
     intersect_n<embree::avx2::OrientedCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Intersect1KEpilog1<8,true>>
               (Precalculations *pre,RayHitK<8> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  long lVar1;
  long lVar2;
  undefined1 (*pauVar3) [12];
  float *pfVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  Primitive PVar6;
  uint uVar7;
  Geometry *pGVar8;
  __int_type_conflict _Var9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  int iVar56;
  uint uVar57;
  uint uVar58;
  ulong uVar59;
  ulong uVar60;
  byte bVar62;
  uint uVar63;
  ulong uVar64;
  uint uVar65;
  long lVar66;
  long lVar67;
  undefined4 uVar68;
  float fVar69;
  float fVar70;
  float fVar103;
  vint4 ai;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  float fVar104;
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  float fVar105;
  undefined8 uVar106;
  vint4 bi_2;
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar143;
  float fVar166;
  float fVar167;
  vint4 bi_1;
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  float fVar168;
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  float fVar144;
  undefined1 auVar153 [16];
  float fVar145;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [32];
  undefined1 auVar165 [32];
  vint4 bi;
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [32];
  vint4 ai_1;
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  vint4 ai_2;
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [32];
  float fVar220;
  float fVar221;
  float fVar236;
  float fVar238;
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [16];
  float fVar240;
  float fVar241;
  float fVar242;
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  float fVar237;
  float fVar239;
  undefined1 auVar235 [32];
  float fVar243;
  float fVar260;
  float fVar261;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  float fVar262;
  undefined1 auVar249 [16];
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 auVar253 [16];
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar252 [16];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  __m128 a;
  undefined1 auVar296 [16];
  undefined1 auVar263 [16];
  undefined1 auVar264 [16];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [32];
  undefined1 auVar275 [16];
  undefined1 auVar276 [16];
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  undefined1 auVar279 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 auVar292 [16];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar297 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  undefined1 auVar302 [32];
  undefined1 auVar303 [32];
  undefined1 auVar304 [32];
  undefined1 auVar305 [16];
  undefined1 auVar306 [16];
  float fVar316;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar311 [16];
  undefined1 auVar312 [16];
  undefined1 auVar313 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [32];
  undefined1 auVar317 [16];
  undefined1 auVar318 [16];
  undefined1 auVar319 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar320 [16];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  float fVar326;
  float fVar336;
  float fVar337;
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  float fVar338;
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  undefined1 auVar335 [32];
  vfloat_impl<4> p01;
  vfloat_impl<4> p00;
  vfloat_impl<4> p02;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  undefined1 local_760 [8];
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined1 local_730 [8];
  float fStack_728;
  float fStack_724;
  undefined1 local_700 [8];
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined1 local_6d0 [8];
  float fStack_6c8;
  float fStack_6c4;
  float local_6c0;
  float fStack_6bc;
  float fStack_6b8;
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_620 [32];
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  float fStack_5e4;
  float local_5e0;
  float fStack_5dc;
  float fStack_5d8;
  float fStack_5d4;
  float local_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  float local_5c0;
  float fStack_5bc;
  float fStack_5b8;
  float fStack_5b4;
  float local_580;
  float fStack_57c;
  float fStack_578;
  float fStack_574;
  RTCFilterFunctionNArguments local_560;
  undefined1 local_530 [8];
  float fStack_528;
  float fStack_524;
  undefined1 local_520 [16];
  undefined1 local_510 [16];
  undefined1 local_500 [16];
  undefined1 local_4f0 [16];
  undefined1 local_4e0 [16];
  uint auStack_4d0 [4];
  undefined1 local_4c0 [32];
  undefined1 local_490 [16];
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  undefined1 local_470 [16];
  undefined1 local_460 [16];
  undefined1 local_450 [16];
  undefined1 local_440 [16];
  undefined1 local_430 [16];
  undefined1 local_420 [16];
  undefined1 local_410 [16];
  undefined1 local_400 [16];
  undefined1 local_3f0 [16];
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [16];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined1 local_390 [16];
  uint uStack_380;
  float afStack_37c [7];
  undefined1 local_360 [32];
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint uStack_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  float local_2c0;
  float fStack_2bc;
  float fStack_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float fStack_2a8;
  float fStack_2a4;
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  undefined4 uStack_284;
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  float local_1e0;
  float fStack_1dc;
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float fStack_1c4;
  float local_1c0;
  float fStack_1bc;
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  ulong auStack_1a0 [4];
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined4 local_140;
  undefined4 uStack_13c;
  undefined4 uStack_138;
  undefined4 uStack_134;
  undefined4 uStack_130;
  undefined4 uStack_12c;
  undefined4 uStack_128;
  undefined4 uStack_124;
  float local_120;
  float fStack_11c;
  float fStack_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float fStack_108;
  float fStack_104;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [32];
  uint local_a0;
  uint uStack_9c;
  uint uStack_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint uStack_88;
  uint uStack_84;
  uint local_80;
  uint uStack_7c;
  uint uStack_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint uStack_68;
  uint uStack_64;
  ulong uVar61;
  float fVar219;
  undefined1 auVar334 [32];
  
  PVar6 = prim[1];
  uVar59 = (ulong)(byte)PVar6;
  auVar17 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 4 + 6)));
  auVar18 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 5 + 6)));
  auVar159 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 6 + 6)));
  auVar19 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0xf + 6)));
  lVar66 = uVar59 * 0x25;
  auVar108._1_3_ = 0;
  auVar108[0] = PVar6;
  auVar20 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)(byte)PVar6 * 0x10 + 6)));
  auVar21 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x11 + 6)));
  auVar114 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x1a + 6)));
  auVar188 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x1b + 6)));
  auVar22 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar59 * 0x1c + 6)));
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  fVar69 = *(float *)(prim + lVar66 + 0x12);
  auVar133 = vsubps_avx(auVar15,*(undefined1 (*) [16])(prim + lVar66 + 6));
  fVar105 = (*(float *)(ray + k * 4 + 0xe0) - *(float *)(prim + lVar66 + 0x16)) *
            *(float *)(prim + lVar66 + 0x1a);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar244._0_4_ = fVar69 * auVar133._0_4_;
  auVar244._4_4_ = fVar69 * auVar133._4_4_;
  auVar244._8_4_ = fVar69 * auVar133._8_4_;
  auVar244._12_4_ = fVar69 * auVar133._12_4_;
  auVar327._0_4_ = fVar69 * auVar15._0_4_;
  auVar327._4_4_ = fVar69 * auVar15._4_4_;
  auVar327._8_4_ = fVar69 * auVar15._8_4_;
  auVar327._12_4_ = fVar69 * auVar15._12_4_;
  auVar15 = vcvtdq2ps_avx(auVar18);
  auVar18 = vcvtdq2ps_avx(auVar159);
  auVar159 = vcvtdq2ps_avx(auVar20);
  auVar20 = vcvtdq2ps_avx(auVar21);
  auVar21 = vcvtdq2ps_avx(auVar188);
  auVar188 = vcvtdq2ps_avx(auVar22);
  auVar22 = vshufps_avx(auVar327,auVar327,0x55);
  auVar133 = vshufps_avx(auVar327,auVar327,0xaa);
  fVar69 = auVar133._0_4_;
  auVar263._0_4_ = fVar69 * auVar18._0_4_;
  fVar103 = auVar133._4_4_;
  auVar263._4_4_ = fVar103 * auVar18._4_4_;
  fVar145 = auVar133._8_4_;
  auVar263._8_4_ = fVar145 * auVar18._8_4_;
  fVar70 = auVar133._12_4_;
  auVar263._12_4_ = fVar70 * auVar18._12_4_;
  auVar222._0_4_ = fVar69 * auVar20._0_4_;
  auVar222._4_4_ = fVar103 * auVar20._4_4_;
  auVar222._8_4_ = fVar145 * auVar20._8_4_;
  auVar222._12_4_ = fVar70 * auVar20._12_4_;
  auVar199._0_4_ = auVar188._0_4_ * fVar69;
  auVar199._4_4_ = auVar188._4_4_ * fVar103;
  auVar199._8_4_ = auVar188._8_4_ * fVar145;
  auVar199._12_4_ = auVar188._12_4_ * fVar70;
  auVar71 = vfmadd231ps_fma(auVar263,auVar22,auVar15);
  auVar107 = vfmadd231ps_fma(auVar222,auVar22,auVar159);
  auVar296 = vfmadd231ps_fma(auVar199,auVar21,auVar22);
  auVar22 = vshufps_avx(auVar244,auVar244,0xaa);
  fVar69 = auVar22._0_4_;
  auVar169._0_4_ = fVar69 * auVar18._0_4_;
  fVar103 = auVar22._4_4_;
  auVar169._4_4_ = fVar103 * auVar18._4_4_;
  fVar145 = auVar22._8_4_;
  auVar169._8_4_ = fVar145 * auVar18._8_4_;
  fVar70 = auVar22._12_4_;
  auVar169._12_4_ = fVar70 * auVar18._12_4_;
  auVar146._0_4_ = fVar69 * auVar20._0_4_;
  auVar146._4_4_ = fVar103 * auVar20._4_4_;
  auVar146._8_4_ = fVar145 * auVar20._8_4_;
  auVar146._12_4_ = fVar70 * auVar20._12_4_;
  auVar131._0_4_ = auVar188._0_4_ * fVar69;
  auVar131._4_4_ = auVar188._4_4_ * fVar103;
  auVar131._8_4_ = auVar188._8_4_ * fVar145;
  auVar131._12_4_ = auVar188._12_4_ * fVar70;
  auVar20 = vshufps_avx(auVar244,auVar244,0x55);
  auVar188 = vfmadd231ps_fma(auVar169,auVar20,auVar15);
  auVar15._8_8_ = 0;
  auVar15._0_8_ = *(ulong *)(prim + uVar59 * 7 + 6);
  auVar22 = vpmovsxwd_avx(auVar15);
  auVar132 = vfmadd231ps_fma(auVar146,auVar20,auVar159);
  auVar18._8_8_ = 0;
  auVar18._0_8_ = *(ulong *)(prim + uVar59 * 0xb + 6);
  auVar133 = vpmovsxwd_avx(auVar18);
  auVar131 = vfmadd231ps_fma(auVar131,auVar20,auVar21);
  auVar159._8_8_ = 0;
  auVar159._0_8_ = *(ulong *)(prim + uVar59 * 9 + 6);
  auVar149 = vpmovsxwd_avx(auVar159);
  auVar20._8_8_ = 0;
  auVar20._0_8_ = *(ulong *)(prim + uVar59 * 0xd + 6);
  auVar72 = vpmovsxwd_avx(auVar20);
  auVar15 = vcvtdq2ps_avx(auVar17);
  auVar18 = vcvtdq2ps_avx(auVar19);
  auVar159 = vcvtdq2ps_avx(auVar114);
  auVar328._4_4_ = auVar327._0_4_;
  auVar328._0_4_ = auVar327._0_4_;
  auVar328._8_4_ = auVar327._0_4_;
  auVar328._12_4_ = auVar327._0_4_;
  auVar20 = vfmadd231ps_fma(auVar71,auVar328,auVar15);
  auVar17 = vfmadd231ps_fma(auVar107,auVar328,auVar18);
  auVar114 = vfmadd231ps_fma(auVar296,auVar159,auVar328);
  auVar245._4_4_ = auVar244._0_4_;
  auVar245._0_4_ = auVar244._0_4_;
  auVar245._8_4_ = auVar244._0_4_;
  auVar245._12_4_ = auVar244._0_4_;
  auVar296 = vfmadd231ps_fma(auVar188,auVar245,auVar15);
  auVar21._8_8_ = 0;
  auVar21._0_8_ = *(ulong *)(prim + uVar59 * 0x12 + 6);
  auVar19 = vpmovsxwd_avx(auVar21);
  auVar132 = vfmadd231ps_fma(auVar132,auVar245,auVar18);
  auVar131 = vfmadd231ps_fma(auVar131,auVar245,auVar159);
  local_4e0._8_4_ = 0x7fffffff;
  local_4e0._0_8_ = 0x7fffffff7fffffff;
  local_4e0._12_4_ = 0x7fffffff;
  auVar15 = vandps_avx(auVar20,local_4e0);
  auVar107._8_4_ = 0x219392ef;
  auVar107._0_8_ = 0x219392ef219392ef;
  auVar107._12_4_ = 0x219392ef;
  auVar15 = vcmpps_avx(auVar15,auVar107,1);
  auVar18 = vblendvps_avx(auVar20,auVar107,auVar15);
  auVar15 = vandps_avx(local_4e0,auVar17);
  auVar15 = vcmpps_avx(auVar15,auVar107,1);
  auVar159 = vblendvps_avx(auVar17,auVar107,auVar15);
  auVar15 = vandps_avx(local_4e0,auVar114);
  auVar15 = vcmpps_avx(auVar15,auVar107,1);
  auVar15 = vblendvps_avx(auVar114,auVar107,auVar15);
  auVar188._8_8_ = 0;
  auVar188._0_8_ = *(ulong *)(prim + uVar59 * 0x16 + 6);
  auVar188 = vpmovsxwd_avx(auVar188);
  auVar17._8_8_ = 0;
  auVar17._0_8_ = *(ulong *)(prim + uVar59 * 0x14 + 6);
  auVar17 = vpmovsxwd_avx(auVar17);
  auVar317._4_4_ = fVar105;
  auVar317._0_4_ = fVar105;
  auVar317._8_4_ = fVar105;
  auVar317._12_4_ = fVar105;
  auVar20 = vcvtdq2ps_avx(auVar22);
  auVar21 = vcvtdq2ps_avx(auVar133);
  auVar21 = vsubps_avx(auVar21,auVar20);
  auVar71 = vfmadd213ps_fma(auVar21,auVar317,auVar20);
  auVar20 = vcvtdq2ps_avx(auVar149);
  auVar21 = vcvtdq2ps_avx(auVar72);
  auVar21 = vsubps_avx(auVar21,auVar20);
  auVar72 = vfmadd213ps_fma(auVar21,auVar317,auVar20);
  auVar20 = vcvtdq2ps_avx(auVar19);
  auVar21 = vcvtdq2ps_avx(auVar188);
  auVar21 = vsubps_avx(auVar21,auVar20);
  auVar107 = vfmadd213ps_fma(auVar21,auVar317,auVar20);
  auVar20 = vcvtdq2ps_avx(auVar17);
  auVar19._8_8_ = 0;
  auVar19._0_8_ = *(ulong *)(prim + uVar59 * 0x18 + 6);
  auVar21 = vpmovsxwd_avx(auVar19);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar188 = vsubps_avx(auVar21,auVar20);
  auVar114._8_8_ = 0;
  auVar114._0_8_ = *(ulong *)(prim + uVar59 * 0x1d + 6);
  auVar21 = vpmovsxwd_avx(auVar114);
  auVar17 = vfmadd213ps_fma(auVar188,auVar317,auVar20);
  auVar20 = vcvtdq2ps_avx(auVar21);
  auVar22._8_8_ = 0;
  auVar22._0_8_ = *(ulong *)(prim + uVar59 * 0x21 + 6);
  auVar21 = vpmovsxwd_avx(auVar22);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar188 = vsubps_avx(auVar21,auVar20);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *(ulong *)(prim + uVar59 * 0x1f + 6);
  auVar21 = vpmovsxwd_avx(auVar133);
  auVar188 = vfmadd213ps_fma(auVar188,auVar317,auVar20);
  auVar20 = vcvtdq2ps_avx(auVar21);
  auVar149._8_8_ = 0;
  auVar149._0_8_ = *(ulong *)(prim + uVar59 * 0x23 + 6);
  auVar21 = vpmovsxwd_avx(auVar149);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar21 = vsubps_avx(auVar21,auVar20);
  auVar21 = vfmadd213ps_fma(auVar21,auVar317,auVar20);
  auVar20 = vrcpps_avx(auVar18);
  auVar305._8_4_ = 0x3f800000;
  auVar305._0_8_ = 0x3f8000003f800000;
  auVar305._12_4_ = 0x3f800000;
  auVar18 = vfnmadd213ps_fma(auVar18,auVar20,auVar305);
  auVar20 = vfmadd132ps_fma(auVar18,auVar20,auVar20);
  auVar18 = vrcpps_avx(auVar159);
  auVar159 = vfnmadd213ps_fma(auVar159,auVar18,auVar305);
  auVar159 = vfmadd132ps_fma(auVar159,auVar18,auVar18);
  auVar18 = vrcpps_avx(auVar15);
  auVar15 = vfnmadd213ps_fma(auVar15,auVar18,auVar305);
  auVar18 = vfmadd132ps_fma(auVar15,auVar18,auVar18);
  auVar15 = vsubps_avx(auVar71,auVar296);
  auVar71._0_4_ = auVar20._0_4_ * auVar15._0_4_;
  auVar71._4_4_ = auVar20._4_4_ * auVar15._4_4_;
  auVar71._8_4_ = auVar20._8_4_ * auVar15._8_4_;
  auVar71._12_4_ = auVar20._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar72,auVar296);
  auVar170._0_4_ = auVar20._0_4_ * auVar15._0_4_;
  auVar170._4_4_ = auVar20._4_4_ * auVar15._4_4_;
  auVar170._8_4_ = auVar20._8_4_ * auVar15._8_4_;
  auVar170._12_4_ = auVar20._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar107,auVar132);
  auVar156._0_4_ = auVar159._0_4_ * auVar15._0_4_;
  auVar156._4_4_ = auVar159._4_4_ * auVar15._4_4_;
  auVar156._8_4_ = auVar159._8_4_ * auVar15._8_4_;
  auVar156._12_4_ = auVar159._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar17,auVar132);
  auVar289._0_4_ = auVar159._0_4_ * auVar15._0_4_;
  auVar289._4_4_ = auVar159._4_4_ * auVar15._4_4_;
  auVar289._8_4_ = auVar159._8_4_ * auVar15._8_4_;
  auVar289._12_4_ = auVar159._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar188,auVar131);
  auVar200._0_4_ = auVar18._0_4_ * auVar15._0_4_;
  auVar200._4_4_ = auVar18._4_4_ * auVar15._4_4_;
  auVar200._8_4_ = auVar18._8_4_ * auVar15._8_4_;
  auVar200._12_4_ = auVar18._12_4_ * auVar15._12_4_;
  auVar15 = vsubps_avx(auVar21,auVar131);
  auVar296._0_4_ = auVar18._0_4_ * auVar15._0_4_;
  auVar296._4_4_ = auVar18._4_4_ * auVar15._4_4_;
  auVar296._8_4_ = auVar18._8_4_ * auVar15._8_4_;
  auVar296._12_4_ = auVar18._12_4_ * auVar15._12_4_;
  auVar15 = vpminsd_avx(auVar71,auVar170);
  auVar18 = vpminsd_avx(auVar156,auVar289);
  auVar15 = vmaxps_avx(auVar15,auVar18);
  auVar18 = vpminsd_avx(auVar200,auVar296);
  uVar68 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar246._4_4_ = uVar68;
  auVar246._0_4_ = uVar68;
  auVar246._8_4_ = uVar68;
  auVar246._12_4_ = uVar68;
  auVar18 = vmaxps_avx(auVar18,auVar246);
  auVar15 = vmaxps_avx(auVar15,auVar18);
  local_490._0_4_ = auVar15._0_4_ * 0.99999964;
  local_490._4_4_ = auVar15._4_4_ * 0.99999964;
  local_490._8_4_ = auVar15._8_4_ * 0.99999964;
  local_490._12_4_ = auVar15._12_4_ * 0.99999964;
  auVar15 = vpmaxsd_avx(auVar71,auVar170);
  auVar18 = vpmaxsd_avx(auVar156,auVar289);
  auVar15 = vminps_avx(auVar15,auVar18);
  auVar18 = vpmaxsd_avx(auVar200,auVar296);
  uVar68 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar132._4_4_ = uVar68;
  auVar132._0_4_ = uVar68;
  auVar132._8_4_ = uVar68;
  auVar132._12_4_ = uVar68;
  auVar18 = vminps_avx(auVar18,auVar132);
  auVar15 = vminps_avx(auVar15,auVar18);
  auVar72._0_4_ = auVar15._0_4_ * 1.0000004;
  auVar72._4_4_ = auVar15._4_4_ * 1.0000004;
  auVar72._8_4_ = auVar15._8_4_ * 1.0000004;
  auVar72._12_4_ = auVar15._12_4_ * 1.0000004;
  auVar108[4] = PVar6;
  auVar108._5_3_ = 0;
  auVar108[8] = PVar6;
  auVar108._9_3_ = 0;
  auVar108[0xc] = PVar6;
  auVar108._13_3_ = 0;
  auVar18 = vpcmpgtd_avx(auVar108,_DAT_01f4ad30);
  auVar15 = vcmpps_avx(local_490,auVar72,2);
  auVar15 = vandps_avx(auVar15,auVar18);
  uVar68 = vmovmskps_avx(auVar15);
  uVar59 = CONCAT44((int)((ulong)prim >> 0x20),uVar68);
  auVar98._16_16_ = mm_lookupmask_ps._240_16_;
  auVar98._0_16_ = mm_lookupmask_ps._240_16_;
  local_300 = vblendps_avx(auVar98,ZEXT832(0) << 0x20,0x80);
  iVar56 = 1 << ((uint)k & 0x1f);
  auVar99._4_4_ = iVar56;
  auVar99._0_4_ = iVar56;
  auVar99._8_4_ = iVar56;
  auVar99._12_4_ = iVar56;
  auVar99._16_4_ = iVar56;
  auVar99._20_4_ = iVar56;
  auVar99._24_4_ = iVar56;
  auVar99._28_4_ = iVar56;
  auVar24 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar98 = vpand_avx2(auVar99,auVar24);
  local_360 = vpcmpeqd_avx2(auVar98,auVar24);
LAB_01297f2d:
  if (uVar59 == 0) {
    return;
  }
  lVar66 = 0;
  for (uVar60 = uVar59; (uVar60 & 1) == 0; uVar60 = uVar60 >> 1 | 0x8000000000000000) {
    lVar66 = lVar66 + 1;
  }
  uVar58 = *(uint *)(prim + 2);
  uVar7 = *(uint *)(prim + lVar66 * 4 + 6);
  pGVar8 = (context->scene->geometries).items[uVar58].ptr;
  fVar69 = (pGVar8->time_range).lower;
  fVar103 = pGVar8->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0xe0) - fVar69) / ((pGVar8->time_range).upper - fVar69));
  auVar15 = vroundss_avx(ZEXT416((uint)fVar103),ZEXT416((uint)fVar103),9);
  auVar15 = vminss_avx(auVar15,ZEXT416((uint)(pGVar8->fnumTimeSegments + -1.0)));
  auVar22 = vmaxss_avx(ZEXT816(0),auVar15);
  uVar60 = (ulong)*(uint *)(*(long *)&pGVar8->field_0x58 +
                           (ulong)uVar7 *
                           pGVar8[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var9 = pGVar8[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar67 = (long)(int)auVar22._0_4_ * 0x38;
  lVar10 = *(long *)(_Var9 + lVar67);
  lVar11 = *(long *)(_Var9 + 0x10 + lVar67);
  auVar15 = *(undefined1 (*) [16])(lVar10 + lVar11 * uVar60);
  lVar66 = uVar60 + 1;
  auVar18 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar66);
  lVar1 = uVar60 + 2;
  auVar159 = *(undefined1 (*) [16])(lVar10 + lVar11 * lVar1);
  lVar2 = uVar60 + 3;
  pauVar3 = (undefined1 (*) [12])(lVar10 + lVar11 * lVar2);
  auVar54 = *pauVar3;
  fVar69 = *(float *)pauVar3[1];
  lVar10 = *(long *)&pGVar8[4].fnumTimeSegments;
  lVar11 = *(long *)(lVar10 + lVar67);
  lVar12 = *(long *)(lVar10 + 0x10 + lVar67);
  auVar20 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar60);
  auVar21 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar66);
  auVar188 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pfVar4 = (float *)(lVar11 + lVar12 * lVar2);
  fVar105 = *pfVar4;
  fVar145 = pfVar4[1];
  fVar70 = pfVar4[2];
  fVar144 = pfVar4[3];
  auVar306._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar306._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar306._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar306._12_4_ = fVar69 * 0.0;
  auVar293._8_4_ = 0x3f000000;
  auVar293._0_8_ = 0x3f0000003f000000;
  auVar293._12_4_ = 0x3f000000;
  auVar17 = vfmadd231ps_fma(auVar306,auVar159,auVar293);
  auVar17 = vfmadd231ps_fma(auVar17,auVar18,ZEXT816(0) << 0x40);
  auVar169 = vfnmadd231ps_fma(auVar17,auVar15,auVar293);
  auVar201._8_4_ = 0x80000000;
  auVar201._0_8_ = 0x8000000080000000;
  auVar201._12_4_ = 0x80000000;
  auVar247._0_4_ = fVar105 * -0.0;
  auVar247._4_4_ = fVar145 * -0.0;
  auVar247._8_4_ = fVar70 * -0.0;
  auVar247._12_4_ = fVar144 * -0.0;
  auVar17 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar188,auVar247);
  auVar223._0_4_ = auVar21._0_4_ + auVar17._0_4_;
  auVar223._4_4_ = auVar21._4_4_ + auVar17._4_4_;
  auVar223._8_4_ = auVar21._8_4_ + auVar17._8_4_;
  auVar223._12_4_ = auVar21._12_4_ + auVar17._12_4_;
  auVar17 = vfmadd231ps_fma(auVar223,auVar20,auVar201);
  auVar133 = ZEXT816(0) << 0x20;
  auVar202._0_4_ = fVar105 * 0.0;
  auVar202._4_4_ = fVar145 * 0.0;
  auVar202._8_4_ = fVar70 * 0.0;
  auVar202._12_4_ = fVar144 * 0.0;
  auVar19 = vfmadd231ps_fma(auVar202,auVar188,auVar293);
  auVar19 = vfmadd231ps_fma(auVar19,auVar21,auVar133);
  auVar114 = vfnmadd231ps_fma(auVar19,auVar20,auVar293);
  auVar287._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar287._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar287._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar287._12_4_ = fVar69 * 0.5;
  auVar19 = vfmadd231ps_fma(auVar287,auVar133,auVar159);
  auVar19 = vfnmadd231ps_fma(auVar19,auVar293,auVar18);
  auVar72 = vfmadd231ps_fma(auVar19,auVar133,auVar15);
  auVar248._0_4_ = auVar247._0_4_ + auVar188._0_4_;
  auVar248._4_4_ = auVar247._4_4_ + auVar188._4_4_;
  auVar248._8_4_ = auVar247._8_4_ + auVar188._8_4_;
  auVar248._12_4_ = auVar247._12_4_ + auVar188._12_4_;
  auVar19 = vfmadd231ps_fma(auVar248,auVar21,auVar133);
  auVar147._8_4_ = 0x80000000;
  auVar147._0_8_ = 0x8000000080000000;
  auVar147._12_4_ = 0x80000000;
  auVar19 = vfmadd231ps_fma(auVar19,auVar20,auVar147);
  auVar183._0_4_ = fVar105 * 0.5;
  auVar183._4_4_ = fVar145 * 0.5;
  auVar183._8_4_ = fVar70 * 0.5;
  auVar183._12_4_ = fVar144 * 0.5;
  auVar188 = vfmadd231ps_fma(auVar183,auVar133,auVar188);
  auVar21 = vfnmadd231ps_fma(auVar188,auVar293,auVar21);
  auVar188 = vfmadd231ps_fma(auVar21,auVar133,auVar20);
  auVar20 = vshufps_avx(auVar169,auVar169,0xc9);
  auVar21 = vshufps_avx(auVar17,auVar17,0xc9);
  fVar241 = auVar169._0_4_;
  auVar109._0_4_ = fVar241 * auVar21._0_4_;
  fVar242 = auVar169._4_4_;
  auVar109._4_4_ = fVar242 * auVar21._4_4_;
  fVar104 = auVar169._8_4_;
  auVar109._8_4_ = fVar104 * auVar21._8_4_;
  fVar316 = auVar169._12_4_;
  auVar109._12_4_ = fVar316 * auVar21._12_4_;
  auVar71 = vfmsub231ps_fma(auVar109,auVar20,auVar17);
  auVar21 = vshufps_avx(auVar114,auVar114,0xc9);
  auVar110._0_4_ = fVar241 * auVar21._0_4_;
  auVar110._4_4_ = fVar242 * auVar21._4_4_;
  auVar110._8_4_ = fVar104 * auVar21._8_4_;
  auVar110._12_4_ = fVar316 * auVar21._12_4_;
  auVar107 = vfmsub231ps_fma(auVar110,auVar20,auVar114);
  auVar20 = vshufps_avx(auVar72,auVar72,0xc9);
  auVar21 = vshufps_avx(auVar19,auVar19,0xc9);
  fVar237 = auVar72._0_4_;
  auVar111._0_4_ = fVar237 * auVar21._0_4_;
  fVar238 = auVar72._4_4_;
  auVar111._4_4_ = fVar238 * auVar21._4_4_;
  fVar239 = auVar72._8_4_;
  auVar111._8_4_ = fVar239 * auVar21._8_4_;
  fVar240 = auVar72._12_4_;
  auVar111._12_4_ = fVar240 * auVar21._12_4_;
  auVar296 = vfmsub231ps_fma(auVar111,auVar20,auVar19);
  auVar21 = vshufps_avx(auVar188,auVar188,0xc9);
  auVar112._0_4_ = fVar237 * auVar21._0_4_;
  auVar112._4_4_ = fVar238 * auVar21._4_4_;
  auVar112._8_4_ = fVar239 * auVar21._8_4_;
  auVar112._12_4_ = fVar240 * auVar21._12_4_;
  auVar132 = vfmsub231ps_fma(auVar112,auVar20,auVar188);
  lVar11 = *(long *)(_Var9 + 0x38 + lVar67);
  lVar12 = *(long *)(_Var9 + 0x48 + lVar67);
  auVar20 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar66);
  auVar21 = *(undefined1 (*) [16])(lVar11 + lVar12 * lVar1);
  pauVar3 = (undefined1 (*) [12])(lVar11 + lVar12 * lVar2);
  auVar55 = *pauVar3;
  fVar144 = *(float *)pauVar3[1];
  lVar13 = *(long *)(lVar10 + 0x38 + lVar67);
  lVar10 = *(long *)(lVar10 + 0x48 + lVar67);
  auVar275._0_4_ = *(float *)*pauVar3 * 0.0;
  auVar275._4_4_ = *(float *)(*pauVar3 + 4) * 0.0;
  auVar275._8_4_ = *(float *)(*pauVar3 + 8) * 0.0;
  auVar275._12_4_ = fVar144 * 0.0;
  auVar188 = vfmadd231ps_fma(auVar275,auVar21,auVar293);
  auVar17 = vfmadd231ps_fma(auVar188,auVar20,auVar133);
  auVar188 = *(undefined1 (*) [16])(lVar11 + lVar12 * uVar60);
  auVar170 = vfnmadd231ps_fma(auVar17,auVar188,auVar293);
  auVar17 = *(undefined1 (*) [16])(lVar13 + lVar1 * lVar10);
  pfVar4 = (float *)(lVar13 + lVar10 * lVar2);
  fVar105 = *pfVar4;
  fVar145 = pfVar4[1];
  fVar70 = pfVar4[2];
  fVar143 = pfVar4[3];
  auVar224._8_4_ = 0x80000000;
  auVar224._0_8_ = 0x8000000080000000;
  auVar224._12_4_ = 0x80000000;
  auVar148._0_4_ = fVar105 * -0.0;
  auVar148._4_4_ = fVar145 * -0.0;
  auVar148._8_4_ = fVar70 * -0.0;
  auVar148._12_4_ = fVar143 * -0.0;
  auVar114 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar17,auVar148);
  auVar19 = *(undefined1 (*) [16])(lVar13 + lVar66 * lVar10);
  auVar184._0_4_ = auVar19._0_4_ + auVar114._0_4_;
  auVar184._4_4_ = auVar19._4_4_ + auVar114._4_4_;
  auVar184._8_4_ = auVar19._8_4_ + auVar114._8_4_;
  auVar184._12_4_ = auVar19._12_4_ + auVar114._12_4_;
  auVar114 = *(undefined1 (*) [16])(lVar13 + uVar60 * lVar10);
  auVar149 = vfmadd231ps_fma(auVar184,auVar114,auVar224);
  auVar133 = vshufps_avx(auVar149,auVar149,0xc9);
  fVar221 = auVar170._0_4_;
  auVar73._0_4_ = fVar221 * auVar133._0_4_;
  fVar219 = auVar170._4_4_;
  auVar73._4_4_ = fVar219 * auVar133._4_4_;
  fVar220 = auVar170._8_4_;
  auVar73._8_4_ = fVar220 * auVar133._8_4_;
  fVar236 = auVar170._12_4_;
  auVar73._12_4_ = fVar236 * auVar133._12_4_;
  auVar133 = vshufps_avx(auVar170,auVar170,0xc9);
  auVar131 = vfmsub231ps_fma(auVar73,auVar133,auVar149);
  auVar74._0_4_ = fVar105 * 0.0;
  auVar74._4_4_ = fVar145 * 0.0;
  auVar74._8_4_ = fVar70 * 0.0;
  auVar74._12_4_ = fVar143 * 0.0;
  auVar171._8_4_ = 0x3f000000;
  auVar171._0_8_ = 0x3f0000003f000000;
  auVar171._12_4_ = 0x3f000000;
  auVar149 = vfmadd231ps_fma(auVar74,auVar17,auVar171);
  auVar149 = vfmadd231ps_fma(auVar149,auVar19,ZEXT816(0) << 0x20);
  auVar108 = vfnmadd231ps_fma(auVar149,auVar114,auVar171);
  auVar149 = vshufps_avx(auVar108,auVar108,0xc9);
  auVar185._0_4_ = fVar221 * auVar149._0_4_;
  auVar185._4_4_ = fVar219 * auVar149._4_4_;
  auVar185._8_4_ = fVar220 * auVar149._8_4_;
  auVar185._12_4_ = fVar236 * auVar149._12_4_;
  auVar108 = vfmsub231ps_fma(auVar185,auVar133,auVar108);
  auVar75._0_4_ = auVar17._0_4_ + auVar148._0_4_;
  auVar75._4_4_ = auVar17._4_4_ + auVar148._4_4_;
  auVar75._8_4_ = auVar17._8_4_ + auVar148._8_4_;
  auVar75._12_4_ = auVar17._12_4_ + auVar148._12_4_;
  auVar113._0_4_ = fVar105 * 0.5;
  auVar113._4_4_ = fVar145 * 0.5;
  auVar113._8_4_ = fVar70 * 0.5;
  auVar113._12_4_ = fVar143 * 0.5;
  auVar149 = ZEXT416(0) << 0x20;
  auVar17 = vfmadd231ps_fma(auVar113,auVar149,auVar17);
  auVar133 = vfmadd231ps_fma(auVar75,auVar19,auVar149);
  auVar17 = vfnmadd231ps_fma(auVar17,auVar171,auVar19);
  auVar19 = vfmadd231ps_fma(auVar133,auVar114,auVar224);
  auVar114 = vfmadd231ps_fma(auVar17,auVar149,auVar114);
  auVar329._0_4_ = *(float *)*pauVar3 * 0.5;
  auVar329._4_4_ = *(float *)(*pauVar3 + 4) * 0.5;
  auVar329._8_4_ = *(float *)(*pauVar3 + 8) * 0.5;
  auVar329._12_4_ = fVar144 * 0.5;
  auVar17 = vfmadd231ps_fma(auVar329,auVar149,auVar21);
  auVar17 = vfnmadd231ps_fma(auVar17,auVar171,auVar20);
  auVar133 = vfmadd231ps_fma(auVar17,auVar149,auVar188);
  auVar51._12_4_ = 0;
  auVar51._0_12_ = ZEXT812(0);
  auVar17 = vshufps_avx(auVar19,auVar19,0xc9);
  fVar326 = auVar133._0_4_;
  auVar150._0_4_ = fVar326 * auVar17._0_4_;
  fVar336 = auVar133._4_4_;
  auVar150._4_4_ = fVar336 * auVar17._4_4_;
  fVar337 = auVar133._8_4_;
  auVar150._8_4_ = fVar337 * auVar17._8_4_;
  fVar338 = auVar133._12_4_;
  auVar150._12_4_ = fVar338 * auVar17._12_4_;
  auVar17 = vshufps_avx(auVar133,auVar133,0xc9);
  auVar146 = vfmsub231ps_fma(auVar150,auVar17,auVar19);
  auVar19 = vshufps_avx(auVar114,auVar114,0xc9);
  auVar76._0_4_ = fVar326 * auVar19._0_4_;
  auVar76._4_4_ = fVar336 * auVar19._4_4_;
  auVar76._8_4_ = fVar337 * auVar19._8_4_;
  auVar76._12_4_ = fVar338 * auVar19._12_4_;
  auVar289 = vfmsub231ps_fma(auVar76,auVar17,auVar114);
  fVar103 = fVar103 - auVar22._0_4_;
  local_6d0._0_4_ = auVar54._0_4_;
  local_6d0._4_4_ = auVar54._4_4_;
  fStack_6c8 = auVar54._8_4_;
  auVar77._0_4_ = (float)local_6d0._0_4_ * -0.0;
  auVar77._4_4_ = (float)local_6d0._4_4_ * -0.0;
  auVar77._8_4_ = fStack_6c8 * -0.0;
  auVar77._12_4_ = fVar69 * -0.0;
  auVar17 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar159,auVar77);
  auVar172._0_4_ = auVar159._0_4_ + auVar77._0_4_;
  auVar172._4_4_ = auVar159._4_4_ + auVar77._4_4_;
  auVar172._8_4_ = auVar159._8_4_ + auVar77._8_4_;
  auVar172._12_4_ = auVar159._12_4_ + auVar77._12_4_;
  auVar186._0_4_ = auVar18._0_4_ + auVar17._0_4_;
  auVar186._4_4_ = auVar18._4_4_ + auVar17._4_4_;
  auVar186._8_4_ = auVar18._8_4_ + auVar17._8_4_;
  auVar186._12_4_ = auVar18._12_4_ + auVar17._12_4_;
  auVar19 = vpermilps_avx(auVar71,0xc9);
  auVar159 = vdpps_avx(auVar19,auVar19,0x7f);
  auVar18 = vfmadd231ps_fma(auVar172,auVar18,auVar51 << 0x20);
  auVar22 = vfmadd231ps_fma(auVar186,auVar15,auVar224);
  auVar149 = vfmadd231ps_fma(auVar18,auVar15,auVar224);
  fVar105 = auVar159._0_4_;
  auVar114 = ZEXT416((uint)fVar105);
  auVar15 = vrsqrtss_avx(auVar114,auVar114);
  fVar69 = auVar15._0_4_;
  fVar69 = fVar69 * 1.5 + fVar69 * fVar69 * fVar105 * -0.5 * fVar69;
  auVar18 = vpermilps_avx(auVar107,0xc9);
  auVar15 = vdpps_avx(auVar19,auVar18,0x7f);
  auVar225._0_4_ = fVar105 * auVar18._0_4_;
  auVar225._4_4_ = fVar105 * auVar18._4_4_;
  auVar225._8_4_ = fVar105 * auVar18._8_4_;
  auVar225._12_4_ = fVar105 * auVar18._12_4_;
  fVar105 = auVar15._0_4_;
  auVar264._0_4_ = fVar105 * auVar19._0_4_;
  auVar264._4_4_ = fVar105 * auVar19._4_4_;
  auVar264._8_4_ = fVar105 * auVar19._8_4_;
  auVar264._12_4_ = fVar105 * auVar19._12_4_;
  auVar17 = vsubps_avx(auVar225,auVar264);
  auVar15 = vrcpss_avx(auVar114,auVar114);
  auVar18 = vfnmadd213ss_fma(auVar159,auVar15,SUB6416(ZEXT464(0x40000000),0));
  fVar145 = auVar15._0_4_ * auVar18._0_4_;
  auVar114 = vpermilps_avx(auVar296,0xc9);
  auVar18 = vdpps_avx(auVar114,auVar114,0x7f);
  fVar243 = auVar19._0_4_ * fVar69;
  fVar260 = auVar19._4_4_ * fVar69;
  fVar261 = auVar19._8_4_ * fVar69;
  fVar262 = auVar19._12_4_ * fVar69;
  auVar19 = vpermilps_avx(auVar132,0xc9);
  auVar15 = vblendps_avx(auVar18,_DAT_01f45a50,0xe);
  auVar159 = vrsqrtss_avx(auVar15,auVar15);
  fVar70 = auVar18._0_4_;
  fVar105 = auVar159._0_4_;
  auVar159 = vdpps_avx(auVar114,auVar19,0x7f);
  fVar105 = fVar105 * 1.5 + fVar105 * fVar70 * -0.5 * fVar105 * fVar105;
  auVar115._0_4_ = fVar70 * auVar19._0_4_;
  auVar115._4_4_ = fVar70 * auVar19._4_4_;
  auVar115._8_4_ = fVar70 * auVar19._8_4_;
  auVar115._12_4_ = fVar70 * auVar19._12_4_;
  fVar70 = auVar159._0_4_;
  auVar134._0_4_ = fVar70 * auVar114._0_4_;
  auVar134._4_4_ = fVar70 * auVar114._4_4_;
  auVar134._8_4_ = fVar70 * auVar114._8_4_;
  auVar134._12_4_ = fVar70 * auVar114._12_4_;
  auVar159 = vsubps_avx(auVar115,auVar134);
  auVar15 = vrcpss_avx(auVar15,auVar15);
  auVar18 = vfnmadd213ss_fma(auVar18,auVar15,ZEXT416(0x40000000));
  fVar70 = auVar15._0_4_ * auVar18._0_4_;
  fVar143 = auVar114._0_4_ * fVar105;
  fVar166 = auVar114._4_4_ * fVar105;
  fVar167 = auVar114._8_4_ * fVar105;
  fVar168 = auVar114._12_4_ * fVar105;
  auVar15 = vshufps_avx(auVar169,auVar169,0xff);
  auVar18 = vshufps_avx(auVar22,auVar22,0xff);
  auVar203._0_4_ = fVar243 * auVar18._0_4_;
  auVar203._4_4_ = fVar260 * auVar18._4_4_;
  auVar203._8_4_ = fVar261 * auVar18._8_4_;
  auVar203._12_4_ = fVar262 * auVar18._12_4_;
  auVar116._0_4_ = fVar243 * auVar15._0_4_ + fVar69 * fVar145 * auVar17._0_4_ * auVar18._0_4_;
  auVar116._4_4_ = fVar260 * auVar15._4_4_ + fVar69 * fVar145 * auVar17._4_4_ * auVar18._4_4_;
  auVar116._8_4_ = fVar261 * auVar15._8_4_ + fVar69 * fVar145 * auVar17._8_4_ * auVar18._8_4_;
  auVar116._12_4_ = fVar262 * auVar15._12_4_ + fVar69 * fVar145 * auVar17._12_4_ * auVar18._12_4_;
  auVar17 = vsubps_avx(auVar22,auVar203);
  local_730._0_4_ = auVar22._0_4_ + auVar203._0_4_;
  local_730._4_4_ = auVar22._4_4_ + auVar203._4_4_;
  fStack_728 = auVar22._8_4_ + auVar203._8_4_;
  fStack_724 = auVar22._12_4_ + auVar203._12_4_;
  auVar19 = vsubps_avx(auVar169,auVar116);
  auVar15 = vshufps_avx(auVar72,auVar72,0xff);
  auVar18 = vshufps_avx(auVar149,auVar149,0xff);
  auVar151._0_4_ = auVar18._0_4_ * fVar143;
  auVar151._4_4_ = auVar18._4_4_ * fVar166;
  auVar151._8_4_ = auVar18._8_4_ * fVar167;
  auVar151._12_4_ = auVar18._12_4_ * fVar168;
  auVar187._0_4_ = auVar15._0_4_ * fVar143 + auVar18._0_4_ * fVar105 * auVar159._0_4_ * fVar70;
  auVar187._4_4_ = auVar15._4_4_ * fVar166 + auVar18._4_4_ * fVar105 * auVar159._4_4_ * fVar70;
  auVar187._8_4_ = auVar15._8_4_ * fVar167 + auVar18._8_4_ * fVar105 * auVar159._8_4_ * fVar70;
  auVar187._12_4_ = auVar15._12_4_ * fVar168 + auVar18._12_4_ * fVar105 * auVar159._12_4_ * fVar70;
  auVar159 = vsubps_avx(auVar149,auVar151);
  local_6d0._4_4_ = auVar149._4_4_ + auVar151._4_4_;
  local_6d0._0_4_ = auVar149._0_4_ + auVar151._0_4_;
  fStack_6c8 = auVar149._8_4_ + auVar151._8_4_;
  fStack_6c4 = auVar149._12_4_ + auVar151._12_4_;
  auVar114 = vsubps_avx(auVar72,auVar187);
  auVar78._8_4_ = 0x80000000;
  auVar78._0_8_ = 0x8000000080000000;
  auVar78._12_4_ = 0x80000000;
  local_6c0 = auVar55._0_4_;
  fStack_6bc = auVar55._4_4_;
  fStack_6b8 = auVar55._8_4_;
  auVar152._0_4_ = local_6c0 * -0.0;
  auVar152._4_4_ = fStack_6bc * -0.0;
  auVar152._8_4_ = fStack_6b8 * -0.0;
  auVar152._12_4_ = fVar144 * -0.0;
  auVar15 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar21,auVar152);
  auVar226._0_4_ = auVar21._0_4_ + auVar152._0_4_;
  auVar226._4_4_ = auVar21._4_4_ + auVar152._4_4_;
  auVar226._8_4_ = auVar21._8_4_ + auVar152._8_4_;
  auVar226._12_4_ = auVar21._12_4_ + auVar152._12_4_;
  auVar318._0_4_ = auVar20._0_4_ + auVar15._0_4_;
  auVar318._4_4_ = auVar20._4_4_ + auVar15._4_4_;
  auVar318._8_4_ = auVar20._8_4_ + auVar15._8_4_;
  auVar318._12_4_ = auVar20._12_4_ + auVar15._12_4_;
  auVar18 = vfmadd231ps_fma(auVar226,auVar20,ZEXT816(0) << 0x20);
  auVar22 = vfmadd231ps_fma(auVar318,auVar188,auVar78);
  auVar21 = vpermilps_avx(auVar131,0xc9);
  auVar15 = vdpps_avx(auVar21,auVar21,0x7f);
  auVar149 = vfmadd231ps_fma(auVar18,auVar188,auVar78);
  fVar105 = auVar15._0_4_;
  auVar188 = ZEXT416((uint)fVar105);
  auVar18 = vrsqrtss_avx(auVar188,auVar188);
  fVar69 = auVar18._0_4_;
  fVar69 = fVar105 * -0.5 * fVar69 * fVar69 * fVar69 + fVar69 * 1.5;
  auVar18 = vpermilps_avx(auVar108,0xc9);
  auVar265._0_4_ = fVar105 * auVar18._0_4_;
  auVar265._4_4_ = fVar105 * auVar18._4_4_;
  auVar265._8_4_ = fVar105 * auVar18._8_4_;
  auVar265._12_4_ = fVar105 * auVar18._12_4_;
  auVar18 = vdpps_avx(auVar21,auVar18,0x7f);
  fVar105 = auVar18._0_4_;
  auVar249._0_4_ = fVar105 * auVar21._0_4_;
  auVar249._4_4_ = fVar105 * auVar21._4_4_;
  auVar249._8_4_ = fVar105 * auVar21._8_4_;
  auVar249._12_4_ = fVar105 * auVar21._12_4_;
  auVar20 = vsubps_avx(auVar265,auVar249);
  auVar18 = vrcpss_avx(auVar188,auVar188);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar18,SUB6416(ZEXT464(0x40000000),0));
  fVar145 = auVar18._0_4_ * auVar15._0_4_;
  fVar144 = auVar21._0_4_ * fVar69;
  fVar143 = auVar21._4_4_ * fVar69;
  fVar166 = auVar21._8_4_ * fVar69;
  fVar167 = auVar21._12_4_ * fVar69;
  auVar188 = vpermilps_avx(auVar146,0xc9);
  auVar15 = vdpps_avx(auVar188,auVar188,0x7f);
  fVar70 = auVar15._0_4_;
  auVar72 = ZEXT416((uint)fVar70);
  auVar18 = vrsqrtss_avx(auVar72,auVar72);
  fVar105 = auVar18._0_4_;
  auVar21 = vpermilps_avx(auVar289,0xc9);
  auVar18 = vdpps_avx(auVar188,auVar21,0x7f);
  fVar105 = fVar105 * 1.5 + fVar70 * -0.5 * fVar105 * fVar105 * fVar105;
  auVar294._0_4_ = fVar70 * auVar21._0_4_;
  auVar294._4_4_ = fVar70 * auVar21._4_4_;
  auVar294._8_4_ = fVar70 * auVar21._8_4_;
  auVar294._12_4_ = fVar70 * auVar21._12_4_;
  fVar70 = auVar18._0_4_;
  auVar79._0_4_ = fVar70 * auVar188._0_4_;
  auVar79._4_4_ = fVar70 * auVar188._4_4_;
  auVar79._8_4_ = fVar70 * auVar188._8_4_;
  auVar79._12_4_ = fVar70 * auVar188._12_4_;
  auVar21 = vsubps_avx(auVar294,auVar79);
  auVar18 = vrcpss_avx(auVar72,auVar72);
  auVar15 = vfnmadd213ss_fma(auVar15,auVar18,SUB6416(ZEXT464(0x40000000),0));
  fVar70 = auVar18._0_4_ * auVar15._0_4_;
  fVar168 = auVar188._0_4_ * fVar105;
  fVar243 = auVar188._4_4_ * fVar105;
  fVar260 = auVar188._8_4_ * fVar105;
  fVar261 = auVar188._12_4_ * fVar105;
  auVar15 = vshufps_avx(auVar170,auVar170,0xff);
  auVar18 = vshufps_avx(auVar22,auVar22,0xff);
  auVar153._0_4_ = auVar18._0_4_ * fVar144;
  auVar153._4_4_ = auVar18._4_4_ * fVar143;
  auVar153._8_4_ = auVar18._8_4_ * fVar166;
  auVar153._12_4_ = auVar18._12_4_ * fVar167;
  auVar173._0_4_ = auVar15._0_4_ * fVar144 + auVar18._0_4_ * fVar69 * auVar20._0_4_ * fVar145;
  auVar173._4_4_ = auVar15._4_4_ * fVar143 + auVar18._4_4_ * fVar69 * auVar20._4_4_ * fVar145;
  auVar173._8_4_ = auVar15._8_4_ * fVar166 + auVar18._8_4_ * fVar69 * auVar20._8_4_ * fVar145;
  auVar173._12_4_ = auVar15._12_4_ * fVar167 + auVar18._12_4_ * fVar69 * auVar20._12_4_ * fVar145;
  auVar20 = vsubps_avx(auVar22,auVar153);
  fVar145 = auVar22._0_4_ + auVar153._0_4_;
  fVar144 = auVar22._4_4_ + auVar153._4_4_;
  fVar143 = auVar22._8_4_ + auVar153._8_4_;
  fVar166 = auVar22._12_4_ + auVar153._12_4_;
  auVar188 = vsubps_avx(auVar170,auVar173);
  auVar15 = vshufps_avx(auVar133,auVar133,0xff);
  auVar18 = vshufps_avx(auVar149,auVar149,0xff);
  auVar250._0_4_ = fVar168 * auVar18._0_4_;
  auVar250._4_4_ = fVar243 * auVar18._4_4_;
  auVar250._8_4_ = fVar260 * auVar18._8_4_;
  auVar250._12_4_ = fVar261 * auVar18._12_4_;
  auVar80._0_4_ = fVar168 * auVar15._0_4_ + auVar18._0_4_ * fVar105 * auVar21._0_4_ * fVar70;
  auVar80._4_4_ = fVar243 * auVar15._4_4_ + auVar18._4_4_ * fVar105 * auVar21._4_4_ * fVar70;
  auVar80._8_4_ = fVar260 * auVar15._8_4_ + auVar18._8_4_ * fVar105 * auVar21._8_4_ * fVar70;
  auVar80._12_4_ = fVar261 * auVar15._12_4_ + auVar18._12_4_ * fVar105 * auVar21._12_4_ * fVar70;
  auVar15 = vsubps_avx(auVar149,auVar250);
  auVar174._0_4_ = auVar250._0_4_ + auVar149._0_4_;
  auVar174._4_4_ = auVar250._4_4_ + auVar149._4_4_;
  auVar174._8_4_ = auVar250._8_4_ + auVar149._8_4_;
  auVar174._12_4_ = auVar250._12_4_ + auVar149._12_4_;
  auVar18 = vsubps_avx(auVar133,auVar80);
  local_640 = auVar19._0_4_;
  fStack_63c = auVar19._4_4_;
  fStack_638 = auVar19._8_4_;
  fStack_634 = auVar19._12_4_;
  auVar81._0_4_ = auVar17._0_4_ + local_640 * 0.33333334;
  auVar81._4_4_ = auVar17._4_4_ + fStack_63c * 0.33333334;
  auVar81._8_4_ = auVar17._8_4_ + fStack_638 * 0.33333334;
  auVar81._12_4_ = auVar17._12_4_ + fStack_634 * 0.33333334;
  fVar69 = 1.0 - fVar103;
  auVar227._4_4_ = fVar69;
  auVar227._0_4_ = fVar69;
  auVar227._8_4_ = fVar69;
  auVar227._12_4_ = fVar69;
  auVar295._0_4_ = fVar103 * auVar20._0_4_;
  auVar295._4_4_ = fVar103 * auVar20._4_4_;
  auVar295._8_4_ = fVar103 * auVar20._8_4_;
  auVar295._12_4_ = fVar103 * auVar20._12_4_;
  local_510 = vfmadd231ps_fma(auVar295,auVar227,auVar17);
  auVar135._0_4_ = fVar103 * (auVar20._0_4_ + auVar188._0_4_ * 0.33333334);
  auVar135._4_4_ = fVar103 * (auVar20._4_4_ + auVar188._4_4_ * 0.33333334);
  auVar135._8_4_ = fVar103 * (auVar20._8_4_ + auVar188._8_4_ * 0.33333334);
  auVar135._12_4_ = fVar103 * (auVar20._12_4_ + auVar188._12_4_ * 0.33333334);
  auVar17 = vfmadd231ps_fma(auVar135,auVar227,auVar81);
  local_700._0_4_ = auVar114._0_4_;
  local_700._4_4_ = auVar114._4_4_;
  uStack_6f8._0_4_ = auVar114._8_4_;
  uStack_6f8._4_4_ = auVar114._12_4_;
  auVar82._0_4_ = (float)local_700._0_4_ * 0.33333334;
  auVar82._4_4_ = (float)local_700._4_4_ * 0.33333334;
  auVar82._8_4_ = (float)uStack_6f8 * 0.33333334;
  auVar82._12_4_ = uStack_6f8._4_4_ * 0.33333334;
  auVar20 = vsubps_avx(auVar159,auVar82);
  auVar307._0_4_ = (float)local_730._0_4_ + (fVar241 + auVar116._0_4_) * 0.33333334;
  auVar307._4_4_ = (float)local_730._4_4_ + (fVar242 + auVar116._4_4_) * 0.33333334;
  auVar307._8_4_ = fStack_728 + (fVar104 + auVar116._8_4_) * 0.33333334;
  auVar307._12_4_ = fStack_724 + (fVar316 + auVar116._12_4_) * 0.33333334;
  auVar288._0_4_ = (fVar237 + auVar187._0_4_) * 0.33333334;
  auVar288._4_4_ = (fVar238 + auVar187._4_4_) * 0.33333334;
  auVar288._8_4_ = (fVar239 + auVar187._8_4_) * 0.33333334;
  auVar288._12_4_ = (fVar240 + auVar187._12_4_) * 0.33333334;
  auVar21 = vsubps_avx(_local_6d0,auVar288);
  auVar276._0_4_ = auVar18._0_4_ * 0.33333334;
  auVar276._4_4_ = auVar18._4_4_ * 0.33333334;
  auVar276._8_4_ = auVar18._8_4_ * 0.33333334;
  auVar276._12_4_ = auVar18._12_4_ * 0.33333334;
  auVar18 = vsubps_avx(auVar15,auVar276);
  auVar251._0_4_ = (fVar326 + auVar80._0_4_) * 0.33333334;
  auVar251._4_4_ = (fVar336 + auVar80._4_4_) * 0.33333334;
  auVar251._8_4_ = (fVar337 + auVar80._8_4_) * 0.33333334;
  auVar251._12_4_ = (fVar338 + auVar80._12_4_) * 0.33333334;
  auVar188 = vsubps_avx(auVar174,auVar251);
  auVar277._0_4_ = fVar103 * auVar18._0_4_;
  auVar277._4_4_ = fVar103 * auVar18._4_4_;
  auVar277._8_4_ = fVar103 * auVar18._8_4_;
  auVar277._12_4_ = fVar103 * auVar18._12_4_;
  auVar204._0_4_ = fVar103 * auVar15._0_4_;
  auVar204._4_4_ = fVar103 * auVar15._4_4_;
  auVar204._8_4_ = fVar103 * auVar15._8_4_;
  auVar204._12_4_ = fVar103 * auVar15._12_4_;
  local_520 = vfmadd231ps_fma(auVar277,auVar227,auVar20);
  auVar19 = vfmadd231ps_fma(auVar204,auVar227,auVar159);
  auVar83._0_4_ = fVar103 * fVar145;
  auVar83._4_4_ = fVar103 * fVar144;
  auVar83._8_4_ = fVar103 * fVar143;
  auVar83._12_4_ = fVar103 * fVar166;
  auVar117._0_4_ = fVar103 * (fVar145 + (fVar221 + auVar173._0_4_) * 0.33333334);
  auVar117._4_4_ = fVar103 * (fVar144 + (fVar219 + auVar173._4_4_) * 0.33333334);
  auVar117._8_4_ = fVar103 * (fVar143 + (fVar220 + auVar173._8_4_) * 0.33333334);
  auVar117._12_4_ = fVar103 * (fVar166 + (fVar236 + auVar173._12_4_) * 0.33333334);
  auVar154._0_4_ = fVar103 * auVar188._0_4_;
  auVar154._4_4_ = fVar103 * auVar188._4_4_;
  auVar154._8_4_ = fVar103 * auVar188._8_4_;
  auVar154._12_4_ = fVar103 * auVar188._12_4_;
  auVar175._0_4_ = fVar103 * auVar174._0_4_;
  auVar175._4_4_ = fVar103 * auVar174._4_4_;
  auVar175._8_4_ = fVar103 * auVar174._8_4_;
  auVar175._12_4_ = fVar103 * auVar174._12_4_;
  _local_530 = vfmadd231ps_fma(auVar83,auVar227,_local_730);
  auVar114 = vfmadd231ps_fma(auVar117,auVar227,auVar307);
  auVar22 = vfmadd231ps_fma(auVar154,auVar227,auVar21);
  auVar133 = vfmadd231ps_fma(auVar175,auVar227,_local_6d0);
  auVar15 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),
                          0x1c);
  auVar15 = vinsertps_avx(auVar15,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  local_4f0 = vsubps_avx(local_510,auVar15);
  auVar18 = vshufps_avx(local_4f0,local_4f0,0x55);
  auVar159 = vshufps_avx(local_4f0,local_4f0,0xaa);
  aVar5 = pre->ray_space[k].vy.field_0;
  fVar69 = pre->ray_space[k].vz.field_0.m128[0];
  fVar105 = pre->ray_space[k].vz.field_0.m128[1];
  fVar103 = pre->ray_space[k].vz.field_0.m128[2];
  fVar145 = pre->ray_space[k].vz.field_0.m128[3];
  auVar84._0_4_ = fVar69 * auVar159._0_4_;
  auVar84._4_4_ = fVar105 * auVar159._4_4_;
  auVar84._8_4_ = fVar103 * auVar159._8_4_;
  auVar84._12_4_ = fVar145 * auVar159._12_4_;
  auVar20 = vfmadd231ps_fma(auVar84,(undefined1  [16])aVar5,auVar18);
  local_500 = vsubps_avx(auVar17,auVar15);
  auVar18 = vshufps_avx(local_500,local_500,0x55);
  auVar159 = vshufps_avx(local_500,local_500,0xaa);
  auVar330._0_4_ = fVar69 * auVar159._0_4_;
  auVar330._4_4_ = fVar105 * auVar159._4_4_;
  auVar330._8_4_ = fVar103 * auVar159._8_4_;
  auVar330._12_4_ = fVar145 * auVar159._12_4_;
  auVar159 = vfmadd231ps_fma(auVar330,(undefined1  [16])aVar5,auVar18);
  local_3e0 = vsubps_avx(local_520,auVar15);
  auVar18 = vshufps_avx(local_3e0,local_3e0,0xaa);
  auVar308._0_4_ = fVar69 * auVar18._0_4_;
  auVar308._4_4_ = fVar105 * auVar18._4_4_;
  auVar308._8_4_ = fVar103 * auVar18._8_4_;
  auVar308._12_4_ = fVar145 * auVar18._12_4_;
  auVar18 = vshufps_avx(local_3e0,local_3e0,0x55);
  auVar21 = vfmadd231ps_fma(auVar308,(undefined1  [16])aVar5,auVar18);
  local_3f0 = vsubps_avx(auVar19,auVar15);
  auVar18 = vshufps_avx(local_3f0,local_3f0,0xaa);
  auVar319._0_4_ = fVar69 * auVar18._0_4_;
  auVar319._4_4_ = fVar105 * auVar18._4_4_;
  auVar319._8_4_ = fVar103 * auVar18._8_4_;
  auVar319._12_4_ = fVar145 * auVar18._12_4_;
  auVar18 = vshufps_avx(local_3f0,local_3f0,0x55);
  auVar188 = vfmadd231ps_fma(auVar319,(undefined1  [16])aVar5,auVar18);
  local_400 = vsubps_avx(_local_530,auVar15);
  auVar18 = vshufps_avx(local_400,local_400,0xaa);
  auVar176._0_4_ = fVar69 * auVar18._0_4_;
  auVar176._4_4_ = fVar105 * auVar18._4_4_;
  auVar176._8_4_ = fVar103 * auVar18._8_4_;
  auVar176._12_4_ = fVar145 * auVar18._12_4_;
  auVar18 = vshufps_avx(local_400,local_400,0x55);
  auVar149 = vfmadd231ps_fma(auVar176,(undefined1  [16])aVar5,auVar18);
  local_410 = vsubps_avx(auVar114,auVar15);
  auVar18 = vshufps_avx(local_410,local_410,0xaa);
  auVar228._0_4_ = fVar69 * auVar18._0_4_;
  auVar228._4_4_ = fVar105 * auVar18._4_4_;
  auVar228._8_4_ = fVar103 * auVar18._8_4_;
  auVar228._12_4_ = fVar145 * auVar18._12_4_;
  auVar18 = vshufps_avx(local_410,local_410,0x55);
  auVar72 = vfmadd231ps_fma(auVar228,(undefined1  [16])aVar5,auVar18);
  local_420 = vsubps_avx(auVar22,auVar15);
  auVar18 = vshufps_avx(local_420,local_420,0xaa);
  auVar266._0_4_ = fVar69 * auVar18._0_4_;
  auVar266._4_4_ = fVar105 * auVar18._4_4_;
  auVar266._8_4_ = fVar103 * auVar18._8_4_;
  auVar266._12_4_ = fVar145 * auVar18._12_4_;
  auVar18 = vshufps_avx(local_420,local_420,0x55);
  auVar18 = vfmadd231ps_fma(auVar266,(undefined1  [16])aVar5,auVar18);
  local_430 = vsubps_avx(auVar133,auVar15);
  auVar15 = vshufps_avx(local_430,local_430,0xaa);
  auVar189._0_4_ = fVar69 * auVar15._0_4_;
  auVar189._4_4_ = fVar105 * auVar15._4_4_;
  auVar189._8_4_ = fVar103 * auVar15._8_4_;
  auVar189._12_4_ = fVar145 * auVar15._12_4_;
  auVar15 = vshufps_avx(local_430,local_430,0x55);
  auVar15 = vfmadd231ps_fma(auVar189,(undefined1  [16])aVar5,auVar15);
  auVar205._4_4_ = local_4f0._0_4_;
  auVar205._0_4_ = local_4f0._0_4_;
  auVar205._8_4_ = local_4f0._0_4_;
  auVar205._12_4_ = local_4f0._0_4_;
  aVar5 = pre->ray_space[k].vx.field_0;
  auVar71 = vfmadd231ps_fma(auVar20,(undefined1  [16])aVar5,auVar205);
  auVar206._4_4_ = local_500._0_4_;
  auVar206._0_4_ = local_500._0_4_;
  auVar206._8_4_ = local_500._0_4_;
  auVar206._12_4_ = local_500._0_4_;
  auVar107 = vfmadd231ps_fma(auVar159,(undefined1  [16])aVar5,auVar206);
  uVar68 = local_3e0._0_4_;
  auVar207._4_4_ = uVar68;
  auVar207._0_4_ = uVar68;
  auVar207._8_4_ = uVar68;
  auVar207._12_4_ = uVar68;
  auVar296 = vfmadd231ps_fma(auVar21,(undefined1  [16])aVar5,auVar207);
  uVar68 = local_3f0._0_4_;
  auVar208._4_4_ = uVar68;
  auVar208._0_4_ = uVar68;
  auVar208._8_4_ = uVar68;
  auVar208._12_4_ = uVar68;
  auVar132 = vfmadd231ps_fma(auVar188,(undefined1  [16])aVar5,auVar208);
  uVar68 = local_400._0_4_;
  auVar209._4_4_ = uVar68;
  auVar209._0_4_ = uVar68;
  auVar209._8_4_ = uVar68;
  auVar209._12_4_ = uVar68;
  auVar149 = vfmadd231ps_fma(auVar149,(undefined1  [16])aVar5,auVar209);
  uVar68 = local_410._0_4_;
  auVar210._4_4_ = uVar68;
  auVar210._0_4_ = uVar68;
  auVar210._8_4_ = uVar68;
  auVar210._12_4_ = uVar68;
  auVar72 = vfmadd231ps_fma(auVar72,(undefined1  [16])aVar5,auVar210);
  uVar68 = local_420._0_4_;
  auVar211._4_4_ = uVar68;
  auVar211._0_4_ = uVar68;
  auVar211._8_4_ = uVar68;
  auVar211._12_4_ = uVar68;
  auVar131 = vfmadd231ps_fma(auVar18,(undefined1  [16])aVar5,auVar211);
  uVar68 = local_430._0_4_;
  auVar212._4_4_ = uVar68;
  auVar212._0_4_ = uVar68;
  auVar212._8_4_ = uVar68;
  auVar212._12_4_ = uVar68;
  auVar108 = vfmadd231ps_fma(auVar15,(undefined1  [16])aVar5,auVar212);
  auVar20 = vmovlhps_avx(auVar71,auVar149);
  auVar21 = vmovlhps_avx(auVar107,auVar72);
  auVar188 = vmovlhps_avx(auVar296,auVar131);
  _local_3c0 = vmovlhps_avx(auVar132,auVar108);
  auVar15 = vminps_avx(auVar20,auVar21);
  auVar18 = vminps_avx(auVar188,_local_3c0);
  auVar159 = vminps_avx(auVar15,auVar18);
  auVar15 = vmaxps_avx(auVar20,auVar21);
  auVar18 = vmaxps_avx(auVar188,_local_3c0);
  auVar15 = vmaxps_avx(auVar15,auVar18);
  auVar18 = vshufpd_avx(auVar159,auVar159,3);
  auVar159 = vminps_avx(auVar159,auVar18);
  auVar18 = vshufpd_avx(auVar15,auVar15,3);
  auVar18 = vmaxps_avx(auVar15,auVar18);
  auVar15 = vandps_avx(local_4e0,auVar159);
  auVar18 = vandps_avx(auVar18,local_4e0);
  auVar15 = vmaxps_avx(auVar15,auVar18);
  auVar18 = vmovshdup_avx(auVar15);
  auVar15 = vmaxss_avx(auVar18,auVar15);
  local_1c0 = auVar15._0_4_ * 9.536743e-07;
  auVar252._8_8_ = auVar71._0_8_;
  auVar252._0_8_ = auVar71._0_8_;
  auVar278._8_8_ = auVar107._0_8_;
  auVar278._0_8_ = auVar107._0_8_;
  auVar309._0_8_ = auVar296._0_8_;
  auVar309._8_8_ = auVar309._0_8_;
  auVar320._0_8_ = auVar132._0_8_;
  auVar320._8_8_ = auVar320._0_8_;
  local_3d0 = ZEXT416((uint)local_1c0);
  fStack_1bc = local_1c0;
  fStack_1b8 = local_1c0;
  fStack_1b4 = local_1c0;
  fStack_1b0 = local_1c0;
  fStack_1ac = local_1c0;
  fStack_1a8 = local_1c0;
  fStack_1a4 = local_1c0;
  fStack_1d8 = -local_1c0;
  local_1e0 = -local_1c0;
  fStack_1dc = -local_1c0;
  fStack_1d4 = fStack_1d8;
  fStack_1d0 = fStack_1d8;
  fStack_1cc = fStack_1d8;
  fStack_1c8 = fStack_1d8;
  fStack_1c4 = fStack_1d8;
  local_320 = uVar58;
  uStack_31c = uVar58;
  uStack_318 = uVar58;
  uStack_314 = uVar58;
  uStack_310 = uVar58;
  uStack_30c = uVar58;
  uStack_308 = uVar58;
  uStack_304 = uVar58;
  local_340 = uVar7;
  uStack_33c = uVar7;
  uStack_338 = uVar7;
  uStack_334 = uVar7;
  uStack_330 = uVar7;
  uStack_32c = uVar7;
  uStack_328 = uVar7;
  uStack_324 = uVar7;
  uVar60 = 0;
  fVar69 = *(float *)(ray + k * 4 + 0x60);
  local_390 = vsubps_avx(auVar21,auVar20);
  local_3a0 = vsubps_avx(auVar188,auVar21);
  local_3b0 = vsubps_avx(_local_3c0,auVar188);
  local_450 = vsubps_avx(_local_530,local_510);
  local_460 = vsubps_avx(auVar114,auVar17);
  local_470 = vsubps_avx(auVar22,local_520);
  _local_480 = vsubps_avx(auVar133,auVar19);
  auVar85 = ZEXT816(0x3f80000000000000);
  local_440 = auVar85;
LAB_01298bd9:
  auVar15 = vshufps_avx(auVar85,auVar85,0x50);
  auVar331._8_4_ = 0x3f800000;
  auVar331._0_8_ = 0x3f8000003f800000;
  auVar331._12_4_ = 0x3f800000;
  auVar334._16_4_ = 0x3f800000;
  auVar334._0_16_ = auVar331;
  auVar334._20_4_ = 0x3f800000;
  auVar334._24_4_ = 0x3f800000;
  auVar334._28_4_ = 0x3f800000;
  auVar18 = vsubps_avx(auVar331,auVar15);
  fVar105 = auVar15._0_4_;
  fVar168 = auVar149._0_4_;
  auVar86._0_4_ = fVar168 * fVar105;
  fVar103 = auVar15._4_4_;
  fVar243 = auVar149._4_4_;
  auVar86._4_4_ = fVar243 * fVar103;
  fVar145 = auVar15._8_4_;
  auVar86._8_4_ = fVar168 * fVar145;
  fVar70 = auVar15._12_4_;
  auVar86._12_4_ = fVar243 * fVar70;
  fVar262 = auVar72._0_4_;
  auVar213._0_4_ = fVar262 * fVar105;
  fVar219 = auVar72._4_4_;
  auVar213._4_4_ = fVar219 * fVar103;
  auVar213._8_4_ = fVar262 * fVar145;
  auVar213._12_4_ = fVar219 * fVar70;
  fVar220 = auVar131._0_4_;
  auVar177._0_4_ = fVar220 * fVar105;
  fVar236 = auVar131._4_4_;
  auVar177._4_4_ = fVar236 * fVar103;
  auVar177._8_4_ = fVar220 * fVar145;
  auVar177._12_4_ = fVar236 * fVar70;
  fVar260 = auVar108._0_4_;
  auVar136._0_4_ = fVar260 * fVar105;
  fVar261 = auVar108._4_4_;
  auVar136._4_4_ = fVar261 * fVar103;
  auVar136._8_4_ = fVar260 * fVar145;
  auVar136._12_4_ = fVar261 * fVar70;
  auVar107 = vfmadd231ps_fma(auVar86,auVar18,auVar252);
  auVar296 = vfmadd231ps_fma(auVar213,auVar18,auVar278);
  auVar132 = vfmadd231ps_fma(auVar177,auVar18,auVar309);
  auVar146 = vfmadd231ps_fma(auVar136,auVar320,auVar18);
  auVar15 = vmovshdup_avx(local_440);
  fVar105 = local_440._0_4_;
  fStack_288 = (auVar15._0_4_ - fVar105) * 0.04761905;
  auVar274._4_4_ = fVar105;
  auVar274._0_4_ = fVar105;
  auVar274._8_4_ = fVar105;
  auVar274._12_4_ = fVar105;
  auVar274._16_4_ = fVar105;
  auVar274._20_4_ = fVar105;
  auVar274._24_4_ = fVar105;
  auVar274._28_4_ = fVar105;
  auVar127._0_8_ = auVar15._0_8_;
  auVar127._8_8_ = auVar127._0_8_;
  auVar127._16_8_ = auVar127._0_8_;
  auVar127._24_8_ = auVar127._0_8_;
  auVar98 = vsubps_avx(auVar127,auVar274);
  uVar68 = auVar107._0_4_;
  auVar324._4_4_ = uVar68;
  auVar324._0_4_ = uVar68;
  auVar324._8_4_ = uVar68;
  auVar324._12_4_ = uVar68;
  auVar324._16_4_ = uVar68;
  auVar324._20_4_ = uVar68;
  auVar324._24_4_ = uVar68;
  auVar324._28_4_ = uVar68;
  auVar15 = vmovshdup_avx(auVar107);
  uVar106 = auVar15._0_8_;
  auVar315._8_8_ = uVar106;
  auVar315._0_8_ = uVar106;
  auVar315._16_8_ = uVar106;
  auVar315._24_8_ = uVar106;
  fVar221 = auVar296._0_4_;
  auVar302._4_4_ = fVar221;
  auVar302._0_4_ = fVar221;
  auVar302._8_4_ = fVar221;
  auVar302._12_4_ = fVar221;
  auVar302._16_4_ = fVar221;
  auVar302._20_4_ = fVar221;
  auVar302._24_4_ = fVar221;
  auVar302._28_4_ = fVar221;
  auVar18 = vmovshdup_avx(auVar296);
  auVar128._0_8_ = auVar18._0_8_;
  auVar128._8_8_ = auVar128._0_8_;
  auVar128._16_8_ = auVar128._0_8_;
  auVar128._24_8_ = auVar128._0_8_;
  fVar167 = auVar132._0_4_;
  auVar233._4_4_ = fVar167;
  auVar233._0_4_ = fVar167;
  auVar233._8_4_ = fVar167;
  auVar233._12_4_ = fVar167;
  auVar233._16_4_ = fVar167;
  auVar233._20_4_ = fVar167;
  auVar233._24_4_ = fVar167;
  auVar233._28_4_ = fVar167;
  auVar159 = vmovshdup_avx(auVar132);
  auVar258._0_8_ = auVar159._0_8_;
  auVar258._8_8_ = auVar258._0_8_;
  auVar258._16_8_ = auVar258._0_8_;
  auVar258._24_8_ = auVar258._0_8_;
  fVar166 = auVar146._0_4_;
  auVar71 = vmovshdup_avx(auVar146);
  auVar289 = vfmadd132ps_fma(auVar98,auVar274,_DAT_01f7b040);
  auVar98 = vsubps_avx(auVar334,ZEXT1632(auVar289));
  fVar105 = auVar289._0_4_;
  fVar103 = auVar289._4_4_;
  auVar24._4_4_ = fVar221 * fVar103;
  auVar24._0_4_ = fVar221 * fVar105;
  fVar145 = auVar289._8_4_;
  auVar24._8_4_ = fVar221 * fVar145;
  fVar70 = auVar289._12_4_;
  auVar24._12_4_ = fVar221 * fVar70;
  auVar24._16_4_ = fVar221 * 0.0;
  auVar24._20_4_ = fVar221 * 0.0;
  auVar24._24_4_ = fVar221 * 0.0;
  auVar24._28_4_ = 0x3f800000;
  auVar289 = vfmadd231ps_fma(auVar24,auVar98,auVar324);
  fVar144 = auVar18._0_4_;
  fVar143 = auVar18._4_4_;
  auVar23._4_4_ = fVar143 * fVar103;
  auVar23._0_4_ = fVar144 * fVar105;
  auVar23._8_4_ = fVar144 * fVar145;
  auVar23._12_4_ = fVar143 * fVar70;
  auVar23._16_4_ = fVar144 * 0.0;
  auVar23._20_4_ = fVar143 * 0.0;
  auVar23._24_4_ = fVar144 * 0.0;
  auVar23._28_4_ = uVar68;
  auVar169 = vfmadd231ps_fma(auVar23,auVar98,auVar315);
  auVar16._4_4_ = fVar167 * fVar103;
  auVar16._0_4_ = fVar167 * fVar105;
  auVar16._8_4_ = fVar167 * fVar145;
  auVar16._12_4_ = fVar167 * fVar70;
  auVar16._16_4_ = fVar167 * 0.0;
  auVar16._20_4_ = fVar167 * 0.0;
  auVar16._24_4_ = fVar167 * 0.0;
  auVar16._28_4_ = auVar15._4_4_;
  auVar170 = vfmadd231ps_fma(auVar16,auVar98,auVar302);
  fVar144 = auVar159._0_4_;
  fVar143 = auVar159._4_4_;
  auVar25._4_4_ = fVar143 * fVar103;
  auVar25._0_4_ = fVar144 * fVar105;
  auVar25._8_4_ = fVar144 * fVar145;
  auVar25._12_4_ = fVar143 * fVar70;
  auVar25._16_4_ = fVar144 * 0.0;
  auVar25._20_4_ = fVar143 * 0.0;
  auVar25._24_4_ = fVar144 * 0.0;
  auVar25._28_4_ = fVar221;
  auVar156 = vfmadd231ps_fma(auVar25,auVar98,auVar128);
  auVar15 = vshufps_avx(auVar107,auVar107,0xaa);
  uStack_6f8 = auVar15._0_8_;
  local_700 = (undefined1  [8])uStack_6f8;
  uStack_6f0 = uStack_6f8;
  uStack_6e8 = uStack_6f8;
  auVar18 = vshufps_avx(auVar107,auVar107,0xff);
  uStack_758 = auVar18._0_8_;
  local_760 = (undefined1  [8])uStack_758;
  uStack_750 = uStack_758;
  uStack_748 = uStack_758;
  auVar26._4_4_ = fVar166 * fVar103;
  auVar26._0_4_ = fVar166 * fVar105;
  auVar26._8_4_ = fVar166 * fVar145;
  auVar26._12_4_ = fVar166 * fVar70;
  auVar26._16_4_ = fVar166 * 0.0;
  auVar26._20_4_ = fVar166 * 0.0;
  auVar26._24_4_ = fVar166 * 0.0;
  auVar26._28_4_ = fVar166;
  auVar107 = vfmadd231ps_fma(auVar26,auVar98,auVar233);
  auVar18 = vshufps_avx(auVar296,auVar296,0xaa);
  auVar234._0_8_ = auVar18._0_8_;
  auVar234._8_8_ = auVar234._0_8_;
  auVar234._16_8_ = auVar234._0_8_;
  auVar234._24_8_ = auVar234._0_8_;
  auVar159 = vshufps_avx(auVar296,auVar296,0xff);
  local_620._8_8_ = auVar159._0_8_;
  local_620._0_8_ = local_620._8_8_;
  local_620._16_8_ = local_620._8_8_;
  local_620._24_8_ = local_620._8_8_;
  fVar144 = auVar71._0_4_;
  fVar143 = auVar71._4_4_;
  auVar27._4_4_ = fVar143 * fVar103;
  auVar27._0_4_ = fVar144 * fVar105;
  auVar27._8_4_ = fVar144 * fVar145;
  auVar27._12_4_ = fVar143 * fVar70;
  auVar27._16_4_ = fVar144 * 0.0;
  auVar27._20_4_ = fVar143 * 0.0;
  auVar27._24_4_ = fVar144 * 0.0;
  auVar27._28_4_ = auVar15._4_4_;
  auVar199 = vfmadd231ps_fma(auVar27,auVar98,auVar258);
  auVar28._28_4_ = fVar143;
  auVar28._0_28_ =
       ZEXT1628(CONCAT412(auVar170._12_4_ * fVar70,
                          CONCAT48(auVar170._8_4_ * fVar145,
                                   CONCAT44(auVar170._4_4_ * fVar103,auVar170._0_4_ * fVar105))));
  auVar289 = vfmadd231ps_fma(auVar28,auVar98,ZEXT1632(auVar289));
  fVar144 = auVar159._4_4_;
  auVar29._28_4_ = fVar144;
  auVar29._0_28_ =
       ZEXT1628(CONCAT412(auVar156._12_4_ * fVar70,
                          CONCAT48(auVar156._8_4_ * fVar145,
                                   CONCAT44(auVar156._4_4_ * fVar103,auVar156._0_4_ * fVar105))));
  auVar169 = vfmadd231ps_fma(auVar29,auVar98,ZEXT1632(auVar169));
  auVar15 = vshufps_avx(auVar132,auVar132,0xaa);
  uVar106 = auVar15._0_8_;
  auVar218._8_8_ = uVar106;
  auVar218._0_8_ = uVar106;
  auVar218._16_8_ = uVar106;
  auVar218._24_8_ = uVar106;
  auVar71 = vshufps_avx(auVar132,auVar132,0xff);
  uVar106 = auVar71._0_8_;
  auVar335._8_8_ = uVar106;
  auVar335._0_8_ = uVar106;
  auVar335._16_8_ = uVar106;
  auVar335._24_8_ = uVar106;
  auVar132 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar107._12_4_ * fVar70,
                                                CONCAT48(auVar107._8_4_ * fVar145,
                                                         CONCAT44(auVar107._4_4_ * fVar103,
                                                                  auVar107._0_4_ * fVar105)))),
                             auVar98,ZEXT1632(auVar170));
  auVar107 = vshufps_avx(auVar146,auVar146,0xaa);
  auVar296 = vshufps_avx(auVar146,auVar146,0xff);
  auVar146 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar70 * auVar199._12_4_,
                                                CONCAT48(fVar145 * auVar199._8_4_,
                                                         CONCAT44(fVar103 * auVar199._4_4_,
                                                                  fVar105 * auVar199._0_4_)))),
                             auVar98,ZEXT1632(auVar156));
  auVar170 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar70 * auVar132._12_4_,
                                                CONCAT48(fVar145 * auVar132._8_4_,
                                                         CONCAT44(fVar103 * auVar132._4_4_,
                                                                  fVar105 * auVar132._0_4_)))),
                             auVar98,ZEXT1632(auVar289));
  auVar24 = vsubps_avx(ZEXT1632(auVar132),ZEXT1632(auVar289));
  auVar132 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar70 * auVar146._12_4_,
                                                CONCAT48(fVar145 * auVar146._8_4_,
                                                         CONCAT44(fVar103 * auVar146._4_4_,
                                                                  fVar105 * auVar146._0_4_)))),
                             auVar98,ZEXT1632(auVar169));
  auVar99 = vsubps_avx(ZEXT1632(auVar146),ZEXT1632(auVar169));
  fStack_5e4 = auVar99._28_4_;
  auVar303._0_4_ = fStack_288 * auVar24._0_4_ * 3.0;
  auVar303._4_4_ = fStack_288 * auVar24._4_4_ * 3.0;
  auVar303._8_4_ = fStack_288 * auVar24._8_4_ * 3.0;
  auVar303._12_4_ = fStack_288 * auVar24._12_4_ * 3.0;
  auVar303._16_4_ = fStack_288 * auVar24._16_4_ * 3.0;
  auVar303._20_4_ = fStack_288 * auVar24._20_4_ * 3.0;
  auVar303._24_4_ = fStack_288 * auVar24._24_4_ * 3.0;
  auVar303._28_4_ = 0;
  local_600._0_4_ = fStack_288 * auVar99._0_4_ * 3.0;
  local_600._4_4_ = fStack_288 * auVar99._4_4_ * 3.0;
  fStack_5f8 = fStack_288 * auVar99._8_4_ * 3.0;
  fStack_5f4 = fStack_288 * auVar99._12_4_ * 3.0;
  fStack_5f0 = fStack_288 * auVar99._16_4_ * 3.0;
  fStack_5ec = fStack_288 * auVar99._20_4_ * 3.0;
  fStack_5e8 = fStack_288 * auVar99._24_4_ * 3.0;
  fVar143 = auVar18._0_4_;
  fVar166 = auVar18._4_4_;
  auVar304._4_4_ = fVar166 * fVar103;
  auVar304._0_4_ = fVar143 * fVar105;
  auVar304._8_4_ = fVar143 * fVar145;
  auVar304._12_4_ = fVar166 * fVar70;
  auVar304._16_4_ = fVar143 * 0.0;
  auVar304._20_4_ = fVar166 * 0.0;
  auVar304._24_4_ = fVar143 * 0.0;
  auVar304._28_4_ = fStack_5e4;
  auVar18 = vfmadd231ps_fma(auVar304,auVar98,_local_700);
  fVar143 = auVar159._0_4_;
  auVar30._4_4_ = fVar144 * fVar103;
  auVar30._0_4_ = fVar143 * fVar105;
  auVar30._8_4_ = fVar143 * fVar145;
  auVar30._12_4_ = fVar144 * fVar70;
  auVar30._16_4_ = fVar143 * 0.0;
  auVar30._20_4_ = fVar144 * 0.0;
  auVar30._24_4_ = fVar143 * 0.0;
  auVar30._28_4_ = 0;
  auVar159 = vfmadd231ps_fma(auVar30,auVar98,_local_760);
  fVar144 = auVar15._0_4_;
  fVar143 = auVar15._4_4_;
  auVar31._4_4_ = fVar143 * fVar103;
  auVar31._0_4_ = fVar144 * fVar105;
  auVar31._8_4_ = fVar144 * fVar145;
  auVar31._12_4_ = fVar143 * fVar70;
  auVar31._16_4_ = fVar144 * 0.0;
  auVar31._20_4_ = fVar143 * 0.0;
  auVar31._24_4_ = fVar144 * 0.0;
  auVar31._28_4_ = auVar24._28_4_;
  auVar15 = vfmadd231ps_fma(auVar31,auVar98,auVar234);
  fVar144 = auVar71._0_4_;
  fVar167 = auVar71._4_4_;
  auVar32._4_4_ = fVar167 * fVar103;
  auVar32._0_4_ = fVar144 * fVar105;
  auVar32._8_4_ = fVar144 * fVar145;
  auVar32._12_4_ = fVar167 * fVar70;
  auVar32._16_4_ = fVar144 * 0.0;
  auVar32._20_4_ = fVar167 * 0.0;
  auVar32._24_4_ = fVar144 * 0.0;
  auVar32._28_4_ = fVar166;
  auVar71 = vfmadd231ps_fma(auVar32,auVar98,local_620);
  auVar25 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar170));
  fVar144 = auVar107._0_4_;
  fVar143 = auVar107._4_4_;
  auVar33._4_4_ = fVar143 * fVar103;
  auVar33._0_4_ = fVar144 * fVar105;
  auVar33._8_4_ = fVar144 * fVar145;
  auVar33._12_4_ = fVar143 * fVar70;
  auVar33._16_4_ = fVar144 * 0.0;
  auVar33._20_4_ = fVar143 * 0.0;
  auVar33._24_4_ = fVar144 * 0.0;
  auVar33._28_4_ = fVar143;
  auVar107 = vfmadd231ps_fma(auVar33,auVar98,auVar218);
  auVar26 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar132));
  fVar144 = auVar296._0_4_;
  fVar143 = auVar296._4_4_;
  auVar34._4_4_ = fVar143 * fVar103;
  auVar34._0_4_ = fVar144 * fVar105;
  auVar34._8_4_ = fVar144 * fVar145;
  auVar34._12_4_ = fVar143 * fVar70;
  auVar34._16_4_ = fVar144 * 0.0;
  auVar34._20_4_ = fVar143 * 0.0;
  auVar34._24_4_ = fVar144 * 0.0;
  auVar34._28_4_ = fVar143;
  auVar296 = vfmadd231ps_fma(auVar34,auVar98,auVar335);
  auVar35._28_4_ = fVar167;
  auVar35._0_28_ =
       ZEXT1628(CONCAT412(auVar15._12_4_ * fVar70,
                          CONCAT48(auVar15._8_4_ * fVar145,
                                   CONCAT44(auVar15._4_4_ * fVar103,auVar15._0_4_ * fVar105))));
  auVar18 = vfmadd231ps_fma(auVar35,auVar98,ZEXT1632(auVar18));
  auVar159 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar70 * auVar71._12_4_,
                                                CONCAT48(fVar145 * auVar71._8_4_,
                                                         CONCAT44(fVar103 * auVar71._4_4_,
                                                                  fVar105 * auVar71._0_4_)))),
                             auVar98,ZEXT1632(auVar159));
  auVar129._0_4_ = auVar170._0_4_ + auVar303._0_4_;
  auVar129._4_4_ = auVar170._4_4_ + auVar303._4_4_;
  auVar129._8_4_ = auVar170._8_4_ + auVar303._8_4_;
  auVar129._12_4_ = auVar170._12_4_ + auVar303._12_4_;
  auVar129._16_4_ = auVar303._16_4_ + 0.0;
  auVar129._20_4_ = auVar303._20_4_ + 0.0;
  auVar129._24_4_ = auVar303._24_4_ + 0.0;
  auVar129._28_4_ = 0;
  auVar15 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar107._12_4_ * fVar70,
                                               CONCAT48(auVar107._8_4_ * fVar145,
                                                        CONCAT44(auVar107._4_4_ * fVar103,
                                                                 auVar107._0_4_ * fVar105)))),
                            auVar98,ZEXT1632(auVar15));
  auVar71 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar296._12_4_ * fVar70,
                                               CONCAT48(auVar296._8_4_ * fVar145,
                                                        CONCAT44(auVar296._4_4_ * fVar103,
                                                                 auVar296._0_4_ * fVar105)))),
                            auVar98,ZEXT1632(auVar71));
  auVar107 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar70 * auVar15._12_4_,
                                                CONCAT48(fVar145 * auVar15._8_4_,
                                                         CONCAT44(fVar103 * auVar15._4_4_,
                                                                  fVar105 * auVar15._0_4_)))),
                             auVar98,ZEXT1632(auVar18));
  auVar296 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar71._12_4_ * fVar70,
                                                CONCAT48(auVar71._8_4_ * fVar145,
                                                         CONCAT44(auVar71._4_4_ * fVar103,
                                                                  auVar71._0_4_ * fVar105)))),
                             ZEXT1632(auVar159),auVar98);
  auVar98 = vsubps_avx(ZEXT1632(auVar15),ZEXT1632(auVar18));
  auVar24 = vsubps_avx(ZEXT1632(auVar71),ZEXT1632(auVar159));
  auVar325._0_4_ = fStack_288 * auVar98._0_4_ * 3.0;
  auVar325._4_4_ = fStack_288 * auVar98._4_4_ * 3.0;
  auVar325._8_4_ = fStack_288 * auVar98._8_4_ * 3.0;
  auVar325._12_4_ = fStack_288 * auVar98._12_4_ * 3.0;
  auVar325._16_4_ = fStack_288 * auVar98._16_4_ * 3.0;
  auVar325._20_4_ = fStack_288 * auVar98._20_4_ * 3.0;
  auVar325._24_4_ = fStack_288 * auVar98._24_4_ * 3.0;
  auVar325._28_4_ = 0;
  local_2a0 = fStack_288 * auVar24._0_4_ * 3.0;
  fStack_29c = fStack_288 * auVar24._4_4_ * 3.0;
  auVar36._4_4_ = fStack_29c;
  auVar36._0_4_ = local_2a0;
  fStack_298 = fStack_288 * auVar24._8_4_ * 3.0;
  auVar36._8_4_ = fStack_298;
  fStack_294 = fStack_288 * auVar24._12_4_ * 3.0;
  auVar36._12_4_ = fStack_294;
  fStack_290 = fStack_288 * auVar24._16_4_ * 3.0;
  auVar36._16_4_ = fStack_290;
  fStack_28c = fStack_288 * auVar24._20_4_ * 3.0;
  auVar36._20_4_ = fStack_28c;
  fStack_288 = fStack_288 * auVar24._24_4_ * 3.0;
  auVar36._24_4_ = fStack_288;
  auVar36._28_4_ = 0x40400000;
  auVar27 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar107));
  auVar28 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar296));
  auVar98 = vsubps_avx(ZEXT1632(auVar107),ZEXT1632(auVar170));
  auVar24 = vsubps_avx(ZEXT1632(auVar296),ZEXT1632(auVar132));
  auVar99 = vsubps_avx(auVar27,auVar25);
  fVar221 = auVar98._0_4_ + auVar99._0_4_;
  fVar237 = auVar98._4_4_ + auVar99._4_4_;
  fVar238 = auVar98._8_4_ + auVar99._8_4_;
  fVar239 = auVar98._12_4_ + auVar99._12_4_;
  fVar240 = auVar98._16_4_ + auVar99._16_4_;
  fVar241 = auVar98._20_4_ + auVar99._20_4_;
  fVar242 = auVar98._24_4_ + auVar99._24_4_;
  auVar23 = vsubps_avx(auVar28,auVar26);
  auVar100._0_4_ = auVar24._0_4_ + auVar23._0_4_;
  auVar100._4_4_ = auVar24._4_4_ + auVar23._4_4_;
  auVar100._8_4_ = auVar24._8_4_ + auVar23._8_4_;
  auVar100._12_4_ = auVar24._12_4_ + auVar23._12_4_;
  auVar100._16_4_ = auVar24._16_4_ + auVar23._16_4_;
  auVar100._20_4_ = auVar24._20_4_ + auVar23._20_4_;
  auVar100._24_4_ = auVar24._24_4_ + auVar23._24_4_;
  auVar100._28_4_ = auVar24._28_4_ + auVar23._28_4_;
  local_240 = ZEXT1632(auVar132);
  fVar105 = auVar132._0_4_;
  local_2c0 = (float)local_600._0_4_ + fVar105;
  fVar103 = auVar132._4_4_;
  fStack_2bc = (float)local_600._4_4_ + fVar103;
  fVar145 = auVar132._8_4_;
  fStack_2b8 = fStack_5f8 + fVar145;
  fVar70 = auVar132._12_4_;
  fStack_2b4 = fStack_5f4 + fVar70;
  fStack_2b0 = fStack_5f0 + 0.0;
  fStack_2ac = fStack_5ec + 0.0;
  fStack_2a8 = fStack_5e8 + 0.0;
  local_200 = ZEXT1632(auVar170);
  auVar24 = vsubps_avx(local_200,auVar303);
  local_220 = vpermps_avx2(_DAT_01fb7720,auVar24);
  auVar24 = vsubps_avx(local_240,_local_600);
  local_2e0 = vpermps_avx2(_DAT_01fb7720,auVar24);
  local_260._0_4_ = auVar107._0_4_ + auVar325._0_4_;
  local_260._4_4_ = auVar107._4_4_ + auVar325._4_4_;
  local_260._8_4_ = auVar107._8_4_ + auVar325._8_4_;
  local_260._12_4_ = auVar107._12_4_ + auVar325._12_4_;
  local_260._16_4_ = auVar325._16_4_ + 0.0;
  local_260._20_4_ = auVar325._20_4_ + 0.0;
  local_260._24_4_ = auVar325._24_4_ + 0.0;
  local_260._28_4_ = 0;
  auVar304 = ZEXT1632(auVar107);
  auVar24 = vsubps_avx(auVar304,auVar325);
  auVar29 = vpermps_avx2(_DAT_01fb7720,auVar24);
  fVar144 = auVar296._0_4_;
  local_2a0 = fVar144 + local_2a0;
  fVar143 = auVar296._4_4_;
  fStack_29c = fVar143 + fStack_29c;
  fVar166 = auVar296._8_4_;
  fStack_298 = fVar166 + fStack_298;
  fVar167 = auVar296._12_4_;
  fStack_294 = fVar167 + fStack_294;
  fStack_290 = fStack_290 + 0.0;
  fStack_28c = fStack_28c + 0.0;
  fStack_288 = fStack_288 + 0.0;
  auVar24 = vsubps_avx(ZEXT1632(auVar296),auVar36);
  local_280 = vpermps_avx2(_DAT_01fb7720,auVar24);
  auVar37._4_4_ = fVar103 * fVar237;
  auVar37._0_4_ = fVar105 * fVar221;
  auVar37._8_4_ = fVar145 * fVar238;
  auVar37._12_4_ = fVar70 * fVar239;
  auVar37._16_4_ = fVar240 * 0.0;
  auVar37._20_4_ = fVar241 * 0.0;
  auVar37._24_4_ = fVar242 * 0.0;
  auVar37._28_4_ = auVar24._28_4_;
  auVar15 = vfnmadd231ps_fma(auVar37,local_200,auVar100);
  fStack_2a4 = fStack_5e4 + 0.0;
  auVar38._4_4_ = fStack_2bc * fVar237;
  auVar38._0_4_ = local_2c0 * fVar221;
  auVar38._8_4_ = fStack_2b8 * fVar238;
  auVar38._12_4_ = fStack_2b4 * fVar239;
  auVar38._16_4_ = fStack_2b0 * fVar240;
  auVar38._20_4_ = fStack_2ac * fVar241;
  auVar38._24_4_ = fStack_2a8 * fVar242;
  auVar38._28_4_ = 0;
  auVar18 = vfnmadd231ps_fma(auVar38,auVar100,auVar129);
  auVar39._4_4_ = local_2e0._4_4_ * fVar237;
  auVar39._0_4_ = local_2e0._0_4_ * fVar221;
  auVar39._8_4_ = local_2e0._8_4_ * fVar238;
  auVar39._12_4_ = local_2e0._12_4_ * fVar239;
  auVar39._16_4_ = local_2e0._16_4_ * fVar240;
  auVar39._20_4_ = local_2e0._20_4_ * fVar241;
  auVar39._24_4_ = local_2e0._24_4_ * fVar242;
  auVar39._28_4_ = fStack_5e4 + 0.0;
  auVar159 = vfnmadd231ps_fma(auVar39,local_220,auVar100);
  local_760._0_4_ = auVar26._0_4_;
  local_760._4_4_ = auVar26._4_4_;
  uStack_758._0_4_ = auVar26._8_4_;
  uStack_758._4_4_ = auVar26._12_4_;
  uStack_750._0_4_ = auVar26._16_4_;
  uStack_750._4_4_ = auVar26._20_4_;
  uStack_748._0_4_ = auVar26._24_4_;
  uStack_748._4_4_ = auVar26._28_4_;
  auVar40._4_4_ = (float)local_760._4_4_ * fVar237;
  auVar40._0_4_ = (float)local_760._0_4_ * fVar221;
  auVar40._8_4_ = (float)uStack_758 * fVar238;
  auVar40._12_4_ = uStack_758._4_4_ * fVar239;
  auVar40._16_4_ = (float)uStack_750 * fVar240;
  auVar40._20_4_ = uStack_750._4_4_ * fVar241;
  auVar40._24_4_ = (float)uStack_748 * fVar242;
  auVar40._28_4_ = uStack_748._4_4_;
  auVar71 = vfnmadd231ps_fma(auVar40,auVar25,auVar100);
  auVar259._0_4_ = fVar144 * fVar221;
  auVar259._4_4_ = fVar143 * fVar237;
  auVar259._8_4_ = fVar166 * fVar238;
  auVar259._12_4_ = fVar167 * fVar239;
  auVar259._16_4_ = fVar240 * 0.0;
  auVar259._20_4_ = fVar241 * 0.0;
  auVar259._24_4_ = fVar242 * 0.0;
  auVar259._28_4_ = 0;
  auVar107 = vfnmadd231ps_fma(auVar259,auVar304,auVar100);
  uStack_284 = 0x40400000;
  auVar41._4_4_ = fStack_29c * fVar237;
  auVar41._0_4_ = local_2a0 * fVar221;
  auVar41._8_4_ = fStack_298 * fVar238;
  auVar41._12_4_ = fStack_294 * fVar239;
  auVar41._16_4_ = fStack_290 * fVar240;
  auVar41._20_4_ = fStack_28c * fVar241;
  auVar41._24_4_ = fStack_288 * fVar242;
  auVar41._28_4_ = auVar25._28_4_;
  auVar132 = vfnmadd231ps_fma(auVar41,local_260,auVar100);
  auVar42._4_4_ = local_280._4_4_ * fVar237;
  auVar42._0_4_ = local_280._0_4_ * fVar221;
  auVar42._8_4_ = local_280._8_4_ * fVar238;
  auVar42._12_4_ = local_280._12_4_ * fVar239;
  auVar42._16_4_ = local_280._16_4_ * fVar240;
  auVar42._20_4_ = local_280._20_4_ * fVar241;
  auVar42._24_4_ = local_280._24_4_ * fVar242;
  auVar42._28_4_ = local_280._28_4_;
  auVar146 = vfnmadd231ps_fma(auVar42,auVar29,auVar100);
  auVar43._4_4_ = auVar28._4_4_ * fVar237;
  auVar43._0_4_ = auVar28._0_4_ * fVar221;
  auVar43._8_4_ = auVar28._8_4_ * fVar238;
  auVar43._12_4_ = auVar28._12_4_ * fVar239;
  auVar43._16_4_ = auVar28._16_4_ * fVar240;
  auVar43._20_4_ = auVar28._20_4_ * fVar241;
  auVar43._24_4_ = auVar28._24_4_ * fVar242;
  auVar43._28_4_ = auVar98._28_4_ + auVar99._28_4_;
  auVar289 = vfnmadd231ps_fma(auVar43,auVar27,auVar100);
  auVar24 = vminps_avx(ZEXT1632(auVar15),ZEXT1632(auVar18));
  auVar98 = vmaxps_avx(ZEXT1632(auVar15),ZEXT1632(auVar18));
  auVar99 = vminps_avx(ZEXT1632(auVar159),ZEXT1632(auVar71));
  auVar99 = vminps_avx(auVar24,auVar99);
  auVar24 = vmaxps_avx(ZEXT1632(auVar159),ZEXT1632(auVar71));
  auVar98 = vmaxps_avx(auVar98,auVar24);
  auVar23 = vminps_avx(ZEXT1632(auVar107),ZEXT1632(auVar132));
  auVar24 = vmaxps_avx(ZEXT1632(auVar107),ZEXT1632(auVar132));
  auVar16 = vminps_avx(ZEXT1632(auVar146),ZEXT1632(auVar289));
  auVar23 = vminps_avx(auVar23,auVar16);
  auVar23 = vminps_avx(auVar99,auVar23);
  auVar99 = vmaxps_avx(ZEXT1632(auVar146),ZEXT1632(auVar289));
  auVar24 = vmaxps_avx(auVar24,auVar99);
  auVar24 = vmaxps_avx(auVar98,auVar24);
  auVar53._4_4_ = fStack_1bc;
  auVar53._0_4_ = local_1c0;
  auVar53._8_4_ = fStack_1b8;
  auVar53._12_4_ = fStack_1b4;
  auVar53._16_4_ = fStack_1b0;
  auVar53._20_4_ = fStack_1ac;
  auVar53._24_4_ = fStack_1a8;
  auVar53._28_4_ = fStack_1a4;
  auVar98 = vcmpps_avx(auVar23,auVar53,2);
  auVar52._4_4_ = fStack_1dc;
  auVar52._0_4_ = local_1e0;
  auVar52._8_4_ = fStack_1d8;
  auVar52._12_4_ = fStack_1d4;
  auVar52._16_4_ = fStack_1d0;
  auVar52._20_4_ = fStack_1cc;
  auVar52._24_4_ = fStack_1c8;
  auVar52._28_4_ = fStack_1c4;
  auVar24 = vcmpps_avx(auVar24,auVar52,5);
  auVar98 = vandps_avx(auVar24,auVar98);
  auVar24 = local_300 & auVar98;
  if ((((((((auVar24 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
           (auVar24 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
          (auVar24 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
         SUB321(auVar24 >> 0x7f,0) != '\0') ||
        (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
       SUB321(auVar24 >> 0xbf,0) != '\0') ||
      (auVar24 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar24[0x1f] < '\0') {
    auVar24 = vsubps_avx(auVar25,local_200);
    auVar99 = vsubps_avx(auVar27,auVar304);
    fVar237 = auVar24._0_4_ + auVar99._0_4_;
    fVar238 = auVar24._4_4_ + auVar99._4_4_;
    fVar239 = auVar24._8_4_ + auVar99._8_4_;
    fVar240 = auVar24._12_4_ + auVar99._12_4_;
    fVar241 = auVar24._16_4_ + auVar99._16_4_;
    fVar242 = auVar24._20_4_ + auVar99._20_4_;
    fVar104 = auVar24._24_4_ + auVar99._24_4_;
    auVar23 = vsubps_avx(auVar26,local_240);
    auVar16 = vsubps_avx(auVar28,ZEXT1632(auVar296));
    auVar130._0_4_ = auVar23._0_4_ + auVar16._0_4_;
    auVar130._4_4_ = auVar23._4_4_ + auVar16._4_4_;
    auVar130._8_4_ = auVar23._8_4_ + auVar16._8_4_;
    auVar130._12_4_ = auVar23._12_4_ + auVar16._12_4_;
    auVar130._16_4_ = auVar23._16_4_ + auVar16._16_4_;
    auVar130._20_4_ = auVar23._20_4_ + auVar16._20_4_;
    auVar130._24_4_ = auVar23._24_4_ + auVar16._24_4_;
    fVar221 = auVar16._28_4_;
    auVar130._28_4_ = auVar23._28_4_ + fVar221;
    auVar44._4_4_ = fVar103 * fVar238;
    auVar44._0_4_ = fVar105 * fVar237;
    auVar44._8_4_ = fVar145 * fVar239;
    auVar44._12_4_ = fVar70 * fVar240;
    auVar44._16_4_ = fVar241 * 0.0;
    auVar44._20_4_ = fVar242 * 0.0;
    auVar44._24_4_ = fVar104 * 0.0;
    auVar44._28_4_ = auVar28._28_4_;
    auVar107 = vfnmadd231ps_fma(auVar44,auVar130,local_200);
    auVar45._4_4_ = fVar238 * fStack_2bc;
    auVar45._0_4_ = fVar237 * local_2c0;
    auVar45._8_4_ = fVar239 * fStack_2b8;
    auVar45._12_4_ = fVar240 * fStack_2b4;
    auVar45._16_4_ = fVar241 * fStack_2b0;
    auVar45._20_4_ = fVar242 * fStack_2ac;
    auVar45._24_4_ = fVar104 * fStack_2a8;
    auVar45._28_4_ = 0;
    auVar15 = vfnmadd213ps_fma(auVar129,auVar130,auVar45);
    auVar46._4_4_ = fVar238 * local_2e0._4_4_;
    auVar46._0_4_ = fVar237 * local_2e0._0_4_;
    auVar46._8_4_ = fVar239 * local_2e0._8_4_;
    auVar46._12_4_ = fVar240 * local_2e0._12_4_;
    auVar46._16_4_ = fVar241 * local_2e0._16_4_;
    auVar46._20_4_ = fVar242 * local_2e0._20_4_;
    auVar46._24_4_ = fVar104 * local_2e0._24_4_;
    auVar46._28_4_ = 0;
    auVar18 = vfnmadd213ps_fma(local_220,auVar130,auVar46);
    auVar47._4_4_ = (float)local_760._4_4_ * fVar238;
    auVar47._0_4_ = (float)local_760._0_4_ * fVar237;
    auVar47._8_4_ = (float)uStack_758 * fVar239;
    auVar47._12_4_ = uStack_758._4_4_ * fVar240;
    auVar47._16_4_ = (float)uStack_750 * fVar241;
    auVar47._20_4_ = uStack_750._4_4_ * fVar242;
    auVar47._24_4_ = (float)uStack_748 * fVar104;
    auVar47._28_4_ = 0;
    auVar296 = vfnmadd231ps_fma(auVar47,auVar130,auVar25);
    auVar164._0_4_ = fVar144 * fVar237;
    auVar164._4_4_ = fVar143 * fVar238;
    auVar164._8_4_ = fVar166 * fVar239;
    auVar164._12_4_ = fVar167 * fVar240;
    auVar164._16_4_ = fVar241 * 0.0;
    auVar164._20_4_ = fVar242 * 0.0;
    auVar164._24_4_ = fVar104 * 0.0;
    auVar164._28_4_ = 0;
    auVar132 = vfnmadd231ps_fma(auVar164,auVar130,auVar304);
    auVar48._4_4_ = fVar238 * fStack_29c;
    auVar48._0_4_ = fVar237 * local_2a0;
    auVar48._8_4_ = fVar239 * fStack_298;
    auVar48._12_4_ = fVar240 * fStack_294;
    auVar48._16_4_ = fVar241 * fStack_290;
    auVar48._20_4_ = fVar242 * fStack_28c;
    auVar48._24_4_ = fVar104 * fStack_288;
    auVar48._28_4_ = fVar221;
    auVar159 = vfnmadd213ps_fma(local_260,auVar130,auVar48);
    auVar49._4_4_ = fVar238 * local_280._4_4_;
    auVar49._0_4_ = fVar237 * local_280._0_4_;
    auVar49._8_4_ = fVar239 * local_280._8_4_;
    auVar49._12_4_ = fVar240 * local_280._12_4_;
    auVar49._16_4_ = fVar241 * local_280._16_4_;
    auVar49._20_4_ = fVar242 * local_280._20_4_;
    auVar49._24_4_ = fVar104 * local_280._24_4_;
    auVar49._28_4_ = fVar221;
    auVar71 = vfnmadd213ps_fma(auVar29,auVar130,auVar49);
    auVar50._4_4_ = fVar238 * auVar28._4_4_;
    auVar50._0_4_ = fVar237 * auVar28._0_4_;
    auVar50._8_4_ = fVar239 * auVar28._8_4_;
    auVar50._12_4_ = fVar240 * auVar28._12_4_;
    auVar50._16_4_ = fVar241 * auVar28._16_4_;
    auVar50._20_4_ = fVar242 * auVar28._20_4_;
    auVar50._24_4_ = fVar104 * auVar28._24_4_;
    auVar50._28_4_ = auVar24._28_4_ + auVar99._28_4_;
    auVar146 = vfnmadd231ps_fma(auVar50,auVar130,auVar27);
    auVar99 = vminps_avx(ZEXT1632(auVar107),ZEXT1632(auVar15));
    auVar24 = vmaxps_avx(ZEXT1632(auVar107),ZEXT1632(auVar15));
    auVar23 = vminps_avx(ZEXT1632(auVar18),ZEXT1632(auVar296));
    auVar23 = vminps_avx(auVar99,auVar23);
    auVar99 = vmaxps_avx(ZEXT1632(auVar18),ZEXT1632(auVar296));
    auVar24 = vmaxps_avx(auVar24,auVar99);
    auVar16 = vminps_avx(ZEXT1632(auVar132),ZEXT1632(auVar159));
    auVar99 = vmaxps_avx(ZEXT1632(auVar132),ZEXT1632(auVar159));
    auVar25 = vminps_avx(ZEXT1632(auVar71),ZEXT1632(auVar146));
    auVar16 = vminps_avx(auVar16,auVar25);
    auVar16 = vminps_avx(auVar23,auVar16);
    auVar23 = vmaxps_avx(ZEXT1632(auVar71),ZEXT1632(auVar146));
    auVar99 = vmaxps_avx(auVar99,auVar23);
    auVar99 = vmaxps_avx(auVar24,auVar99);
    auVar24 = vcmpps_avx(auVar16,auVar53,2);
    auVar99 = vcmpps_avx(auVar99,auVar52,5);
    auVar24 = vandps_avx(auVar99,auVar24);
    auVar98 = vandps_avx(auVar98,local_300);
    auVar99 = auVar98 & auVar24;
    if ((((((((auVar99 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar99 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar99 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar99 >> 0x7f,0) != '\0') ||
          (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar99 >> 0xbf,0) != '\0') ||
        (auVar99 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar99[0x1f] < '\0')
    {
      auVar98 = vandps_avx(auVar24,auVar98);
      uVar65 = vmovmskps_avx(auVar98);
      if (uVar65 != 0) {
        auStack_4d0[uVar60] = uVar65 & 0xff;
        uVar106 = vmovlps_avx(local_440);
        *(undefined8 *)(&uStack_380 + uVar60 * 2) = uVar106;
        uVar64 = vmovlps_avx(auVar85);
        auStack_1a0[uVar60] = uVar64;
        uVar60 = (ulong)((int)uVar60 + 1);
      }
    }
  }
LAB_0129918a:
  if ((int)uVar60 == 0) {
    uVar68 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar97._4_4_ = uVar68;
    auVar97._0_4_ = uVar68;
    auVar97._8_4_ = uVar68;
    auVar97._12_4_ = uVar68;
    auVar15 = vcmpps_avx(local_490,auVar97,2);
    uVar58 = vmovmskps_avx(auVar15);
    uVar59 = (ulong)((uint)uVar59 & (uint)uVar59 + 0xf & uVar58);
    goto LAB_01297f2d;
  }
  uVar57 = (int)uVar60 - 1;
  uVar61 = (ulong)uVar57;
  uVar63 = auStack_4d0[uVar61];
  uVar65 = (&uStack_380)[uVar61 * 2];
  fVar105 = afStack_37c[uVar61 * 2];
  iVar56 = 0;
  for (uVar64 = (ulong)uVar63; (uVar64 & 1) == 0; uVar64 = uVar64 >> 1 | 0x8000000000000000) {
    iVar56 = iVar56 + 1;
  }
  uVar63 = uVar63 - 1 & uVar63;
  if (uVar63 == 0) {
    uVar60 = (ulong)uVar57;
  }
  auVar85._8_8_ = 0;
  auVar85._0_8_ = auStack_1a0[uVar61];
  auStack_4d0[uVar61] = uVar63;
  fVar103 = (float)(iVar56 + 1) * 0.14285715;
  auVar15 = vfmadd231ss_fma(ZEXT416((uint)(fVar105 * (float)iVar56 * 0.14285715)),ZEXT416(uVar65),
                            ZEXT416((uint)(1.0 - (float)iVar56 * 0.14285715)));
  auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar105 * fVar103)),ZEXT416(uVar65),
                            ZEXT416((uint)(1.0 - fVar103)));
  fVar103 = auVar18._0_4_;
  auVar235._0_4_ = auVar15._0_4_;
  fVar105 = fVar103 - auVar235._0_4_;
  if (fVar105 < 0.16666667) {
    auVar159 = vshufps_avx(auVar85,auVar85,0x50);
    auVar118._8_4_ = 0x3f800000;
    auVar118._0_8_ = 0x3f8000003f800000;
    auVar118._12_4_ = 0x3f800000;
    auVar71 = vsubps_avx(auVar118,auVar159);
    fVar145 = auVar159._0_4_;
    auVar178._0_4_ = fVar145 * fVar168;
    fVar70 = auVar159._4_4_;
    auVar178._4_4_ = fVar70 * fVar243;
    fVar144 = auVar159._8_4_;
    auVar178._8_4_ = fVar144 * fVar168;
    fVar143 = auVar159._12_4_;
    auVar178._12_4_ = fVar143 * fVar243;
    auVar190._0_4_ = fVar145 * fVar262;
    auVar190._4_4_ = fVar70 * fVar219;
    auVar190._8_4_ = fVar144 * fVar262;
    auVar190._12_4_ = fVar143 * fVar219;
    auVar214._0_4_ = fVar145 * fVar220;
    auVar214._4_4_ = fVar70 * fVar236;
    auVar214._8_4_ = fVar144 * fVar220;
    auVar214._12_4_ = fVar143 * fVar236;
    auVar87._0_4_ = fVar145 * fVar260;
    auVar87._4_4_ = fVar70 * fVar261;
    auVar87._8_4_ = fVar144 * fVar260;
    auVar87._12_4_ = fVar143 * fVar261;
    auVar159 = vfmadd231ps_fma(auVar178,auVar71,auVar252);
    auVar107 = vfmadd231ps_fma(auVar190,auVar71,auVar278);
    auVar296 = vfmadd231ps_fma(auVar214,auVar71,auVar309);
    auVar71 = vfmadd231ps_fma(auVar87,auVar71,auVar320);
    auVar165._16_16_ = auVar159;
    auVar165._0_16_ = auVar159;
    auVar182._16_16_ = auVar107;
    auVar182._0_16_ = auVar107;
    auVar198._16_16_ = auVar296;
    auVar198._0_16_ = auVar296;
    auVar235._4_4_ = auVar235._0_4_;
    auVar235._8_4_ = auVar235._0_4_;
    auVar235._12_4_ = auVar235._0_4_;
    auVar235._20_4_ = fVar103;
    auVar235._16_4_ = fVar103;
    auVar235._24_4_ = fVar103;
    auVar235._28_4_ = fVar103;
    auVar98 = vsubps_avx(auVar182,auVar165);
    auVar107 = vfmadd213ps_fma(auVar98,auVar235,auVar165);
    auVar98 = vsubps_avx(auVar198,auVar182);
    auVar132 = vfmadd213ps_fma(auVar98,auVar235,auVar182);
    auVar159 = vsubps_avx(auVar71,auVar296);
    auVar101._16_16_ = auVar159;
    auVar101._0_16_ = auVar159;
    auVar159 = vfmadd213ps_fma(auVar101,auVar235,auVar198);
    auVar98 = vsubps_avx(ZEXT1632(auVar132),ZEXT1632(auVar107));
    auVar71 = vfmadd213ps_fma(auVar98,auVar235,ZEXT1632(auVar107));
    auVar98 = vsubps_avx(ZEXT1632(auVar159),ZEXT1632(auVar132));
    auVar159 = vfmadd213ps_fma(auVar98,auVar235,ZEXT1632(auVar132));
    auVar98 = vsubps_avx(ZEXT1632(auVar159),ZEXT1632(auVar71));
    auVar169 = vfmadd231ps_fma(ZEXT1632(auVar71),auVar98,auVar235);
    fVar145 = fVar105 * 0.33333334;
    auVar229._0_8_ =
         CONCAT44(auVar169._4_4_ + fVar145 * auVar98._4_4_ * 3.0,
                  auVar169._0_4_ + fVar145 * auVar98._0_4_ * 3.0);
    auVar229._8_4_ = auVar169._8_4_ + fVar145 * auVar98._8_4_ * 3.0;
    auVar229._12_4_ = auVar169._12_4_ + fVar145 * auVar98._12_4_ * 3.0;
    auVar71 = vshufpd_avx(auVar169,auVar169,3);
    auVar107 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
    auVar159 = vsubps_avx(auVar71,auVar169);
    auVar296 = vsubps_avx(auVar107,(undefined1  [16])0x0);
    auVar88._0_4_ = auVar159._0_4_ + auVar296._0_4_;
    auVar88._4_4_ = auVar159._4_4_ + auVar296._4_4_;
    auVar88._8_4_ = auVar159._8_4_ + auVar296._8_4_;
    auVar88._12_4_ = auVar159._12_4_ + auVar296._12_4_;
    auVar159 = vshufps_avx(auVar169,auVar169,0xb1);
    auVar296 = vshufps_avx(auVar229,auVar229,0xb1);
    auVar321._4_4_ = auVar88._0_4_;
    auVar321._0_4_ = auVar88._0_4_;
    auVar321._8_4_ = auVar88._0_4_;
    auVar321._12_4_ = auVar88._0_4_;
    auVar132 = vshufps_avx(auVar88,auVar88,0x55);
    fVar70 = auVar132._0_4_;
    auVar89._0_4_ = fVar70 * auVar159._0_4_;
    fVar144 = auVar132._4_4_;
    auVar89._4_4_ = fVar144 * auVar159._4_4_;
    fVar143 = auVar132._8_4_;
    auVar89._8_4_ = fVar143 * auVar159._8_4_;
    fVar166 = auVar132._12_4_;
    auVar89._12_4_ = fVar166 * auVar159._12_4_;
    auVar191._0_4_ = fVar70 * auVar296._0_4_;
    auVar191._4_4_ = fVar144 * auVar296._4_4_;
    auVar191._8_4_ = fVar143 * auVar296._8_4_;
    auVar191._12_4_ = fVar166 * auVar296._12_4_;
    auVar146 = vfmadd231ps_fma(auVar89,auVar321,auVar169);
    auVar289 = vfmadd231ps_fma(auVar191,auVar321,auVar229);
    auVar296 = vshufps_avx(auVar146,auVar146,0xe8);
    auVar132 = vshufps_avx(auVar289,auVar289,0xe8);
    auVar159 = vcmpps_avx(auVar296,auVar132,1);
    uVar65 = vextractps_avx(auVar159,0);
    auVar170 = auVar289;
    if ((uVar65 & 1) == 0) {
      auVar170 = auVar146;
    }
    auVar155._0_4_ = fVar145 * auVar98._16_4_ * 3.0;
    auVar155._4_4_ = fVar145 * auVar98._20_4_ * 3.0;
    auVar155._8_4_ = fVar145 * auVar98._24_4_ * 3.0;
    auVar155._12_4_ = fVar145 * 0.0;
    auVar222 = vsubps_avx((undefined1  [16])0x0,auVar155);
    auVar156 = vshufps_avx(auVar222,auVar222,0xb1);
    auVar199 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
    auVar230._0_4_ = fVar70 * auVar156._0_4_;
    auVar230._4_4_ = fVar144 * auVar156._4_4_;
    auVar230._8_4_ = fVar143 * auVar156._8_4_;
    auVar230._12_4_ = fVar166 * auVar156._12_4_;
    auVar253._0_4_ = auVar199._0_4_ * fVar70;
    auVar253._4_4_ = auVar199._4_4_ * fVar144;
    auVar253._8_4_ = auVar199._8_4_ * fVar143;
    auVar253._12_4_ = auVar199._12_4_ * fVar166;
    auVar244 = vfmadd231ps_fma(auVar230,auVar321,auVar222);
    auVar245 = vfmadd231ps_fma(auVar253,(undefined1  [16])0x0,auVar321);
    auVar199 = vshufps_avx(auVar244,auVar244,0xe8);
    auVar200 = vshufps_avx(auVar245,auVar245,0xe8);
    auVar156 = vcmpps_avx(auVar199,auVar200,1);
    uVar65 = vextractps_avx(auVar156,0);
    auVar246 = auVar245;
    if ((uVar65 & 1) == 0) {
      auVar246 = auVar244;
    }
    auVar170 = vmaxss_avx(auVar246,auVar170);
    auVar296 = vminps_avx(auVar296,auVar132);
    auVar132 = vminps_avx(auVar199,auVar200);
    auVar132 = vminps_avx(auVar296,auVar132);
    auVar159 = vshufps_avx(auVar159,auVar159,0x55);
    auVar159 = vblendps_avx(auVar159,auVar156,2);
    auVar156 = vpslld_avx(auVar159,0x1f);
    auVar159 = vshufpd_avx(auVar289,auVar289,1);
    auVar159 = vinsertps_avx(auVar159,auVar245,0x9c);
    auVar296 = vshufpd_avx(auVar146,auVar146,1);
    auVar296 = vinsertps_avx(auVar296,auVar244,0x9c);
    auVar159 = vblendvps_avx(auVar296,auVar159,auVar156);
    auVar296 = vmovshdup_avx(auVar159);
    auVar159 = vmaxss_avx(auVar296,auVar159);
    fVar143 = auVar132._0_4_;
    auVar296 = vmovshdup_avx(auVar132);
    fVar144 = auVar159._0_4_;
    fVar145 = auVar296._0_4_;
    fVar70 = auVar170._0_4_;
    if (((0.0001 <= fVar143) || (fVar144 <= -0.0001)) && (0.0001 <= fVar145 || fVar144 <= -0.0001))
    goto code_r0x01299498;
    goto LAB_012994be;
  }
  local_440 = vinsertps_avx(auVar15,auVar18,0x10);
  goto LAB_01298bd9;
code_r0x01299498:
  auVar296 = vcmpps_avx(auVar296,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar146 = vcmpps_avx(auVar132,SUB6416(ZEXT464(0x38d1b717),0),5);
  auVar296 = vandps_avx(auVar146,auVar296);
  if (fVar70 <= -0.0001 || (auVar296 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
  goto LAB_0129918a;
LAB_012994be:
  auVar146 = vcmpps_avx(auVar132,_DAT_01f45a50,1);
  auVar289 = SUB6416(ZEXT864(0),0) << 0x20;
  auVar296 = vcmpss_avx(auVar170,ZEXT816(0) << 0x20,1);
  auVar119._8_4_ = 0x3f800000;
  auVar119._0_8_ = 0x3f8000003f800000;
  auVar119._12_4_ = 0x3f800000;
  auVar137._8_4_ = 0xbf800000;
  auVar137._0_8_ = 0xbf800000bf800000;
  auVar137._12_4_ = 0xbf800000;
  auVar296 = vblendvps_avx(auVar119,auVar137,auVar296);
  auVar146 = vblendvps_avx(auVar119,auVar137,auVar146);
  fVar167 = auVar146._0_4_;
  fVar166 = auVar296._0_4_;
  auVar296 = SUB6416(ZEXT864(0),0) << 0x20;
  if ((fVar167 == fVar166) && (!NAN(fVar167) && !NAN(fVar166))) {
    auVar296 = SUB6416(ZEXT464(0x7f800000),0);
  }
  if ((fVar167 == fVar166) && (!NAN(fVar167) && !NAN(fVar166))) {
    auVar289 = SUB6416(ZEXT464(0xff800000),0);
  }
  auVar146 = vmovshdup_avx(auVar146);
  fVar221 = auVar146._0_4_;
  if ((fVar167 != fVar221) || (NAN(fVar167) || NAN(fVar221))) {
    if ((fVar145 != fVar143) || (NAN(fVar145) || NAN(fVar143))) {
      auVar157._0_8_ = auVar132._0_8_ ^ 0x8000000080000000;
      auVar157._8_4_ = auVar132._8_4_ ^ 0x80000000;
      auVar157._12_4_ = auVar132._12_4_ ^ 0x80000000;
      auVar158._0_4_ = -fVar143 / (fVar145 - fVar143);
      auVar158._4_12_ = auVar157._4_12_;
      auVar132 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar158._0_4_)),auVar158,ZEXT416(0));
      auVar146 = auVar132;
    }
    else {
      auVar132 = ZEXT816(0) << 0x20;
      if ((fVar143 != 0.0) || (auVar146 = SUB6416(ZEXT464(0x3f800000),0), NAN(fVar143))) {
        auVar132 = SUB6416(ZEXT464(0x7f800000),0);
        auVar146 = SUB6416(ZEXT464(0xff800000),0);
      }
    }
    auVar296 = vminss_avx(auVar296,auVar132);
    auVar289 = vmaxss_avx(auVar146,auVar289);
  }
  auVar159 = vcmpss_avx(auVar159,ZEXT416(0),1);
  auVar120._8_4_ = 0x3f800000;
  auVar120._0_8_ = 0x3f8000003f800000;
  auVar120._12_4_ = 0x3f800000;
  auVar138._8_4_ = 0xbf800000;
  auVar138._0_8_ = 0xbf800000bf800000;
  auVar138._12_4_ = 0xbf800000;
  auVar159 = vblendvps_avx(auVar120,auVar138,auVar159);
  fVar145 = auVar159._0_4_;
  if ((fVar166 != fVar145) || (NAN(fVar166) || NAN(fVar145))) {
    if ((fVar144 != fVar70) || (NAN(fVar144) || NAN(fVar70))) {
      auVar90._0_8_ = auVar170._0_8_ ^ 0x8000000080000000;
      auVar90._8_4_ = auVar170._8_4_ ^ 0x80000000;
      auVar90._12_4_ = auVar170._12_4_ ^ 0x80000000;
      auVar160._0_4_ = -fVar70 / (fVar144 - fVar70);
      auVar160._4_12_ = auVar90._4_12_;
      auVar159 = vfmadd132ss_fma(ZEXT416((uint)(1.0 - auVar160._0_4_)),auVar160,ZEXT416(0));
      auVar132 = auVar159;
    }
    else {
      auVar159 = SUB6416(ZEXT464(0x3f800000),0);
      if ((fVar70 != 0.0) || (auVar132 = SUB6416(ZEXT864(0),0) << 0x20, NAN(fVar70))) {
        auVar159 = SUB6416(ZEXT464(0xff800000),0);
        auVar132 = SUB6416(ZEXT464(0x7f800000),0);
      }
    }
    auVar296 = vminss_avx(auVar296,auVar132);
    auVar289 = vmaxss_avx(auVar159,auVar289);
  }
  if ((fVar221 != fVar145) || (NAN(fVar221) || NAN(fVar145))) {
    auVar296 = vminss_avx(auVar296,SUB6416(ZEXT464(0x3f800000),0));
    auVar289 = vmaxss_avx(SUB6416(ZEXT464(0x3f800000),0),auVar289);
  }
  auVar159 = vmaxss_avx(ZEXT816(0) << 0x40,auVar296);
  auVar296 = vminss_avx(auVar289,SUB6416(ZEXT464(0x3f800000),0));
  if (auVar296._0_4_ < auVar159._0_4_) goto LAB_0129918a;
  auVar159 = vmaxss_avx(ZEXT816(0),ZEXT416((uint)(auVar159._0_4_ + -0.1)));
  auVar296 = vminss_avx(ZEXT416((uint)(auVar296._0_4_ + 0.1)),SUB6416(ZEXT464(0x3f800000),0));
  auVar179._0_8_ = auVar169._0_8_;
  auVar179._8_8_ = auVar179._0_8_;
  auVar267._8_8_ = auVar229._0_8_;
  auVar267._0_8_ = auVar229._0_8_;
  auVar279._8_8_ = auVar222._0_8_;
  auVar279._0_8_ = auVar222._0_8_;
  auVar132 = vshufpd_avx(auVar229,auVar229,3);
  auVar146 = vshufpd_avx(auVar222,auVar222,3);
  auVar289 = vshufps_avx(auVar159,auVar296,0);
  auVar91._8_4_ = 0x3f800000;
  auVar91._0_8_ = 0x3f8000003f800000;
  auVar91._12_4_ = 0x3f800000;
  auVar169 = vsubps_avx(auVar91,auVar289);
  local_580 = auVar71._0_4_;
  fStack_57c = auVar71._4_4_;
  fStack_578 = auVar71._8_4_;
  fStack_574 = auVar71._12_4_;
  fVar145 = auVar289._0_4_;
  auVar92._0_4_ = fVar145 * local_580;
  fVar70 = auVar289._4_4_;
  auVar92._4_4_ = fVar70 * fStack_57c;
  fVar144 = auVar289._8_4_;
  auVar92._8_4_ = fVar144 * fStack_578;
  fVar143 = auVar289._12_4_;
  auVar92._12_4_ = fVar143 * fStack_574;
  auVar215._0_4_ = fVar145 * auVar132._0_4_;
  auVar215._4_4_ = fVar70 * auVar132._4_4_;
  auVar215._8_4_ = fVar144 * auVar132._8_4_;
  auVar215._12_4_ = fVar143 * auVar132._12_4_;
  auVar231._0_4_ = fVar145 * auVar146._0_4_;
  auVar231._4_4_ = fVar70 * auVar146._4_4_;
  auVar231._8_4_ = fVar144 * auVar146._8_4_;
  auVar231._12_4_ = fVar143 * auVar146._12_4_;
  local_640 = auVar107._0_4_;
  fStack_63c = auVar107._4_4_;
  fStack_638 = auVar107._8_4_;
  fStack_634 = auVar107._12_4_;
  auVar254._0_4_ = fVar145 * local_640;
  auVar254._4_4_ = fVar70 * fStack_63c;
  auVar254._8_4_ = fVar144 * fStack_638;
  auVar254._12_4_ = fVar143 * fStack_634;
  auVar132 = vfmadd231ps_fma(auVar92,auVar169,auVar179);
  auVar146 = vfmadd231ps_fma(auVar215,auVar169,auVar267);
  auVar289 = vfmadd231ps_fma(auVar231,auVar169,auVar279);
  auVar169 = vfmadd231ps_fma(auVar254,auVar169,ZEXT816(0));
  auVar71 = vmovshdup_avx(auVar85);
  auVar222 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar159._0_4_)),auVar85,
                             ZEXT416((uint)(1.0 - auVar159._0_4_)));
  auVar244 = vfmadd231ss_fma(ZEXT416((uint)(auVar71._0_4_ * auVar296._0_4_)),auVar85,
                             ZEXT416((uint)(1.0 - auVar296._0_4_)));
  fVar145 = 1.0 / fVar105;
  auVar159 = vsubps_avx(auVar146,auVar132);
  auVar268._0_4_ = auVar159._0_4_ * 3.0;
  auVar268._4_4_ = auVar159._4_4_ * 3.0;
  auVar268._8_4_ = auVar159._8_4_ * 3.0;
  auVar268._12_4_ = auVar159._12_4_ * 3.0;
  auVar159 = vsubps_avx(auVar289,auVar146);
  auVar280._0_4_ = auVar159._0_4_ * 3.0;
  auVar280._4_4_ = auVar159._4_4_ * 3.0;
  auVar280._8_4_ = auVar159._8_4_ * 3.0;
  auVar280._12_4_ = auVar159._12_4_ * 3.0;
  auVar159 = vsubps_avx(auVar169,auVar289);
  auVar290._0_4_ = auVar159._0_4_ * 3.0;
  auVar290._4_4_ = auVar159._4_4_ * 3.0;
  auVar290._8_4_ = auVar159._8_4_ * 3.0;
  auVar290._12_4_ = auVar159._12_4_ * 3.0;
  auVar71 = vminps_avx(auVar280,auVar290);
  auVar159 = vmaxps_avx(auVar280,auVar290);
  auVar71 = vminps_avx(auVar268,auVar71);
  auVar159 = vmaxps_avx(auVar268,auVar159);
  auVar107 = vshufpd_avx(auVar71,auVar71,3);
  auVar296 = vshufpd_avx(auVar159,auVar159,3);
  auVar71 = vminps_avx(auVar71,auVar107);
  auVar159 = vmaxps_avx(auVar159,auVar296);
  auVar281._0_4_ = auVar71._0_4_ * fVar145;
  auVar281._4_4_ = auVar71._4_4_ * fVar145;
  auVar281._8_4_ = auVar71._8_4_ * fVar145;
  auVar281._12_4_ = auVar71._12_4_ * fVar145;
  auVar269._0_4_ = auVar159._0_4_ * fVar145;
  auVar269._4_4_ = auVar159._4_4_ * fVar145;
  auVar269._8_4_ = auVar159._8_4_ * fVar145;
  auVar269._12_4_ = auVar159._12_4_ * fVar145;
  fVar145 = 1.0 / (auVar244._0_4_ - auVar222._0_4_);
  auVar159 = vshufpd_avx(auVar132,auVar132,3);
  auVar71 = vshufpd_avx(auVar146,auVar146,3);
  auVar107 = vshufpd_avx(auVar289,auVar289,3);
  auVar296 = vshufpd_avx(auVar169,auVar169,3);
  auVar159 = vsubps_avx(auVar159,auVar132);
  auVar132 = vsubps_avx(auVar71,auVar146);
  auVar146 = vsubps_avx(auVar107,auVar289);
  auVar296 = vsubps_avx(auVar296,auVar169);
  auVar71 = vminps_avx(auVar159,auVar132);
  auVar159 = vmaxps_avx(auVar159,auVar132);
  auVar107 = vminps_avx(auVar146,auVar296);
  auVar107 = vminps_avx(auVar71,auVar107);
  auVar71 = vmaxps_avx(auVar146,auVar296);
  auVar159 = vmaxps_avx(auVar159,auVar71);
  auVar310._0_4_ = fVar145 * auVar107._0_4_;
  auVar310._4_4_ = fVar145 * auVar107._4_4_;
  auVar310._8_4_ = fVar145 * auVar107._8_4_;
  auVar310._12_4_ = fVar145 * auVar107._12_4_;
  auVar297._0_4_ = fVar145 * auVar159._0_4_;
  auVar297._4_4_ = fVar145 * auVar159._4_4_;
  auVar297._8_4_ = fVar145 * auVar159._8_4_;
  auVar297._12_4_ = fVar145 * auVar159._12_4_;
  auVar296 = vinsertps_avx(auVar15,auVar222,0x10);
  auVar132 = vinsertps_avx(auVar18,auVar244,0x10);
  auVar291._0_4_ = (auVar296._0_4_ + auVar132._0_4_) * 0.5;
  auVar291._4_4_ = (auVar296._4_4_ + auVar132._4_4_) * 0.5;
  auVar291._8_4_ = (auVar296._8_4_ + auVar132._8_4_) * 0.5;
  auVar291._12_4_ = (auVar296._12_4_ + auVar132._12_4_) * 0.5;
  auVar93._4_4_ = auVar291._0_4_;
  auVar93._0_4_ = auVar291._0_4_;
  auVar93._8_4_ = auVar291._0_4_;
  auVar93._12_4_ = auVar291._0_4_;
  auVar159 = vfmadd213ps_fma(local_390,auVar93,auVar20);
  auVar71 = vfmadd213ps_fma(local_3a0,auVar93,auVar21);
  auVar107 = vfmadd213ps_fma(local_3b0,auVar93,auVar188);
  auVar18 = vsubps_avx(auVar71,auVar159);
  auVar159 = vfmadd213ps_fma(auVar18,auVar93,auVar159);
  auVar18 = vsubps_avx(auVar107,auVar71);
  auVar18 = vfmadd213ps_fma(auVar18,auVar93,auVar71);
  auVar18 = vsubps_avx(auVar18,auVar159);
  auVar159 = vfmadd231ps_fma(auVar159,auVar18,auVar93);
  auVar94._0_8_ = CONCAT44(auVar18._4_4_ * 3.0,auVar18._0_4_ * 3.0);
  auVar94._8_4_ = auVar18._8_4_ * 3.0;
  auVar94._12_4_ = auVar18._12_4_ * 3.0;
  auVar322._8_8_ = auVar159._0_8_;
  auVar322._0_8_ = auVar159._0_8_;
  auVar18 = vshufpd_avx(auVar159,auVar159,3);
  auVar159 = vshufps_avx(auVar291,auVar291,0x55);
  auVar289 = vsubps_avx(auVar18,auVar322);
  auVar170 = vfmadd231ps_fma(auVar322,auVar159,auVar289);
  auVar332._8_8_ = auVar94._0_8_;
  auVar332._0_8_ = auVar94._0_8_;
  auVar18 = vshufpd_avx(auVar94,auVar94,3);
  auVar18 = vsubps_avx(auVar18,auVar332);
  auVar169 = vfmadd213ps_fma(auVar18,auVar159,auVar332);
  auVar159 = vmovshdup_avx(auVar169);
  auVar333._0_8_ = auVar159._0_8_ ^ 0x8000000080000000;
  auVar333._8_4_ = auVar159._8_4_ ^ 0x80000000;
  auVar333._12_4_ = auVar159._12_4_ ^ 0x80000000;
  auVar71 = vmovshdup_avx(auVar289);
  auVar18 = vunpcklps_avx(auVar71,auVar333);
  auVar107 = vshufps_avx(auVar18,auVar333,4);
  auVar146 = vshufps_avx(auVar291,auVar291,0x54);
  auVar161._0_8_ = auVar289._0_8_ ^ 0x8000000080000000;
  auVar161._8_4_ = auVar289._8_4_ ^ 0x80000000;
  auVar161._12_4_ = auVar289._12_4_ ^ 0x80000000;
  auVar18 = vmovlhps_avx(auVar161,auVar169);
  auVar18 = vshufps_avx(auVar18,auVar169,8);
  auVar159 = vfmsub231ss_fma(ZEXT416((uint)(auVar289._0_4_ * auVar159._0_4_)),auVar71,auVar169);
  uVar68 = auVar159._0_4_;
  auVar95._4_4_ = uVar68;
  auVar95._0_4_ = uVar68;
  auVar95._8_4_ = uVar68;
  auVar95._12_4_ = uVar68;
  auVar159 = vdivps_avx(auVar107,auVar95);
  auVar71 = vdivps_avx(auVar18,auVar95);
  fVar144 = auVar170._0_4_;
  fVar145 = auVar159._0_4_;
  auVar18 = vshufps_avx(auVar170,auVar170,0x55);
  fVar70 = auVar71._0_4_;
  auVar96._0_4_ = fVar144 * fVar145 + auVar18._0_4_ * fVar70;
  auVar96._4_4_ = fVar144 * auVar159._4_4_ + auVar18._4_4_ * auVar71._4_4_;
  auVar96._8_4_ = fVar144 * auVar159._8_4_ + auVar18._8_4_ * auVar71._8_4_;
  auVar96._12_4_ = fVar144 * auVar159._12_4_ + auVar18._12_4_ * auVar71._12_4_;
  auVar200 = vsubps_avx(auVar146,auVar96);
  auVar146 = vmovshdup_avx(auVar159);
  auVar18 = vinsertps_avx(auVar281,auVar310,0x1c);
  auVar192._0_4_ = auVar146._0_4_ * auVar18._0_4_;
  auVar192._4_4_ = auVar146._4_4_ * auVar18._4_4_;
  auVar192._8_4_ = auVar146._8_4_ * auVar18._8_4_;
  auVar192._12_4_ = auVar146._12_4_ * auVar18._12_4_;
  auVar107 = vinsertps_avx(auVar269,auVar297,0x1c);
  auVar121._0_4_ = auVar107._0_4_ * auVar146._0_4_;
  auVar121._4_4_ = auVar107._4_4_ * auVar146._4_4_;
  auVar121._8_4_ = auVar107._8_4_ * auVar146._8_4_;
  auVar121._12_4_ = auVar107._12_4_ * auVar146._12_4_;
  auVar170 = vminps_avx(auVar192,auVar121);
  auVar169 = vmaxps_avx(auVar121,auVar192);
  auVar146 = vinsertps_avx(auVar310,auVar281,0x4c);
  auVar156 = vmovshdup_avx(auVar71);
  auVar289 = vinsertps_avx(auVar297,auVar269,0x4c);
  auVar298._0_4_ = auVar156._0_4_ * auVar146._0_4_;
  auVar298._4_4_ = auVar156._4_4_ * auVar146._4_4_;
  auVar298._8_4_ = auVar156._8_4_ * auVar146._8_4_;
  auVar298._12_4_ = auVar156._12_4_ * auVar146._12_4_;
  auVar282._0_4_ = auVar156._0_4_ * auVar289._0_4_;
  auVar282._4_4_ = auVar156._4_4_ * auVar289._4_4_;
  auVar282._8_4_ = auVar156._8_4_ * auVar289._8_4_;
  auVar282._12_4_ = auVar156._12_4_ * auVar289._12_4_;
  auVar156 = vminps_avx(auVar298,auVar282);
  auVar311._0_4_ = auVar170._0_4_ + auVar156._0_4_;
  auVar311._4_4_ = auVar170._4_4_ + auVar156._4_4_;
  auVar311._8_4_ = auVar170._8_4_ + auVar156._8_4_;
  auVar311._12_4_ = auVar170._12_4_ + auVar156._12_4_;
  auVar170 = vmaxps_avx(auVar282,auVar298);
  auVar122._0_4_ = auVar170._0_4_ + auVar169._0_4_;
  auVar122._4_4_ = auVar170._4_4_ + auVar169._4_4_;
  auVar122._8_4_ = auVar170._8_4_ + auVar169._8_4_;
  auVar122._12_4_ = auVar170._12_4_ + auVar169._12_4_;
  auVar283._8_8_ = 0x3f80000000000000;
  auVar283._0_8_ = 0x3f80000000000000;
  auVar169 = vsubps_avx(auVar283,auVar122);
  auVar170 = vsubps_avx(auVar283,auVar311);
  auVar156 = vsubps_avx(auVar296,auVar291);
  auVar199 = vsubps_avx(auVar132,auVar291);
  auVar139._0_4_ = fVar145 * auVar18._0_4_;
  auVar139._4_4_ = fVar145 * auVar18._4_4_;
  auVar139._8_4_ = fVar145 * auVar18._8_4_;
  auVar139._12_4_ = fVar145 * auVar18._12_4_;
  auVar312._0_4_ = fVar145 * auVar107._0_4_;
  auVar312._4_4_ = fVar145 * auVar107._4_4_;
  auVar312._8_4_ = fVar145 * auVar107._8_4_;
  auVar312._12_4_ = fVar145 * auVar107._12_4_;
  auVar107 = vminps_avx(auVar139,auVar312);
  auVar18 = vmaxps_avx(auVar312,auVar139);
  auVar193._0_4_ = fVar70 * auVar146._0_4_;
  auVar193._4_4_ = fVar70 * auVar146._4_4_;
  auVar193._8_4_ = fVar70 * auVar146._8_4_;
  auVar193._12_4_ = fVar70 * auVar146._12_4_;
  auVar270._0_4_ = fVar70 * auVar289._0_4_;
  auVar270._4_4_ = fVar70 * auVar289._4_4_;
  auVar270._8_4_ = fVar70 * auVar289._8_4_;
  auVar270._12_4_ = fVar70 * auVar289._12_4_;
  auVar146 = vminps_avx(auVar193,auVar270);
  auVar313._0_4_ = auVar107._0_4_ + auVar146._0_4_;
  auVar313._4_4_ = auVar107._4_4_ + auVar146._4_4_;
  auVar313._8_4_ = auVar107._8_4_ + auVar146._8_4_;
  auVar313._12_4_ = auVar107._12_4_ + auVar146._12_4_;
  fVar221 = auVar156._0_4_;
  auVar323._0_4_ = fVar221 * auVar169._0_4_;
  fVar237 = auVar156._4_4_;
  auVar323._4_4_ = fVar237 * auVar169._4_4_;
  fVar238 = auVar156._8_4_;
  auVar323._8_4_ = fVar238 * auVar169._8_4_;
  fVar239 = auVar156._12_4_;
  auVar323._12_4_ = fVar239 * auVar169._12_4_;
  auVar107 = vmaxps_avx(auVar270,auVar193);
  auVar271._0_4_ = fVar221 * auVar170._0_4_;
  auVar271._4_4_ = fVar237 * auVar170._4_4_;
  auVar271._8_4_ = fVar238 * auVar170._8_4_;
  auVar271._12_4_ = fVar239 * auVar170._12_4_;
  fVar144 = auVar199._0_4_;
  auVar123._0_4_ = fVar144 * auVar169._0_4_;
  fVar143 = auVar199._4_4_;
  auVar123._4_4_ = fVar143 * auVar169._4_4_;
  fVar166 = auVar199._8_4_;
  auVar123._8_4_ = fVar166 * auVar169._8_4_;
  fVar167 = auVar199._12_4_;
  auVar123._12_4_ = fVar167 * auVar169._12_4_;
  auVar284._0_4_ = fVar144 * auVar170._0_4_;
  auVar284._4_4_ = fVar143 * auVar170._4_4_;
  auVar284._8_4_ = fVar166 * auVar170._8_4_;
  auVar284._12_4_ = fVar167 * auVar170._12_4_;
  auVar140._0_4_ = auVar18._0_4_ + auVar107._0_4_;
  auVar140._4_4_ = auVar18._4_4_ + auVar107._4_4_;
  auVar140._8_4_ = auVar18._8_4_ + auVar107._8_4_;
  auVar140._12_4_ = auVar18._12_4_ + auVar107._12_4_;
  auVar194._8_8_ = 0x3f800000;
  auVar194._0_8_ = 0x3f800000;
  auVar18 = vsubps_avx(auVar194,auVar140);
  auVar107 = vsubps_avx(auVar194,auVar313);
  auVar314._0_4_ = fVar221 * auVar18._0_4_;
  auVar314._4_4_ = fVar237 * auVar18._4_4_;
  auVar314._8_4_ = fVar238 * auVar18._8_4_;
  auVar314._12_4_ = fVar239 * auVar18._12_4_;
  auVar299._0_4_ = fVar221 * auVar107._0_4_;
  auVar299._4_4_ = fVar237 * auVar107._4_4_;
  auVar299._8_4_ = fVar238 * auVar107._8_4_;
  auVar299._12_4_ = fVar239 * auVar107._12_4_;
  auVar141._0_4_ = fVar144 * auVar18._0_4_;
  auVar141._4_4_ = fVar143 * auVar18._4_4_;
  auVar141._8_4_ = fVar166 * auVar18._8_4_;
  auVar141._12_4_ = fVar167 * auVar18._12_4_;
  auVar195._0_4_ = fVar144 * auVar107._0_4_;
  auVar195._4_4_ = fVar143 * auVar107._4_4_;
  auVar195._8_4_ = fVar166 * auVar107._8_4_;
  auVar195._12_4_ = fVar167 * auVar107._12_4_;
  auVar18 = vminps_avx(auVar314,auVar299);
  auVar107 = vminps_avx(auVar141,auVar195);
  auVar18 = vminps_avx(auVar18,auVar107);
  auVar107 = vmaxps_avx(auVar299,auVar314);
  auVar146 = vmaxps_avx(auVar195,auVar141);
  auVar289 = vminps_avx(auVar323,auVar271);
  auVar169 = vminps_avx(auVar123,auVar284);
  auVar289 = vminps_avx(auVar289,auVar169);
  auVar18 = vhaddps_avx(auVar18,auVar289);
  auVar107 = vmaxps_avx(auVar146,auVar107);
  auVar146 = vmaxps_avx(auVar271,auVar323);
  auVar289 = vmaxps_avx(auVar284,auVar123);
  auVar146 = vmaxps_avx(auVar289,auVar146);
  auVar107 = vhaddps_avx(auVar107,auVar146);
  auVar18 = vshufps_avx(auVar18,auVar18,0xe8);
  auVar107 = vshufps_avx(auVar107,auVar107,0xe8);
  auVar285._0_4_ = auVar200._0_4_ + auVar18._0_4_;
  auVar285._4_4_ = auVar200._4_4_ + auVar18._4_4_;
  auVar285._8_4_ = auVar200._8_4_ + auVar18._8_4_;
  auVar285._12_4_ = auVar200._12_4_ + auVar18._12_4_;
  auVar272._0_4_ = auVar200._0_4_ + auVar107._0_4_;
  auVar272._4_4_ = auVar200._4_4_ + auVar107._4_4_;
  auVar272._8_4_ = auVar200._8_4_ + auVar107._8_4_;
  auVar272._12_4_ = auVar200._12_4_ + auVar107._12_4_;
  auVar18 = vmaxps_avx(auVar296,auVar285);
  auVar107 = vminps_avx(auVar272,auVar132);
  auVar18 = vcmpps_avx(auVar107,auVar18,1);
  auVar18 = vshufps_avx(auVar18,auVar18,0x50);
  if ((auVar18 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0 || auVar18[0xf] < '\0')
  goto LAB_0129918a;
  bVar62 = 0;
  if ((auVar235._0_4_ < auVar285._0_4_) && (bVar62 = 0, auVar272._0_4_ < auVar132._0_4_)) {
    auVar107 = vmovshdup_avx(auVar285);
    auVar18 = vcmpps_avx(auVar272,auVar132,1);
    bVar62 = auVar18[4] & auVar222._0_4_ < auVar107._0_4_;
  }
  if (((3 < (uint)uVar60 || fVar105 < 0.001) | bVar62) == 1) {
    lVar66 = 0xc9;
    do {
      lVar66 = lVar66 + -1;
      if (lVar66 == 0) goto LAB_0129918a;
      fVar143 = auVar200._0_4_;
      fVar144 = 1.0 - fVar143;
      fVar105 = fVar144 * fVar144 * fVar144;
      fVar103 = fVar143 * 3.0 * fVar144 * fVar144;
      fVar144 = fVar144 * fVar143 * fVar143 * 3.0;
      auVar180._4_4_ = fVar105;
      auVar180._0_4_ = fVar105;
      auVar180._8_4_ = fVar105;
      auVar180._12_4_ = fVar105;
      auVar142._4_4_ = fVar103;
      auVar142._0_4_ = fVar103;
      auVar142._8_4_ = fVar103;
      auVar142._12_4_ = fVar103;
      auVar124._4_4_ = fVar144;
      auVar124._0_4_ = fVar144;
      auVar124._8_4_ = fVar144;
      auVar124._12_4_ = fVar144;
      fVar143 = fVar143 * fVar143 * fVar143;
      auVar196._0_4_ = (float)local_3c0._0_4_ * fVar143;
      auVar196._4_4_ = (float)local_3c0._4_4_ * fVar143;
      auVar196._8_4_ = fStack_3b8 * fVar143;
      auVar196._12_4_ = fStack_3b4 * fVar143;
      auVar15 = vfmadd231ps_fma(auVar196,auVar188,auVar124);
      auVar15 = vfmadd231ps_fma(auVar15,auVar21,auVar142);
      auVar15 = vfmadd231ps_fma(auVar15,auVar20,auVar180);
      auVar125._8_8_ = auVar15._0_8_;
      auVar125._0_8_ = auVar15._0_8_;
      auVar15 = vshufpd_avx(auVar15,auVar15,3);
      auVar18 = vshufps_avx(auVar200,auVar200,0x55);
      auVar15 = vsubps_avx(auVar15,auVar125);
      auVar18 = vfmadd213ps_fma(auVar15,auVar18,auVar125);
      fVar105 = auVar18._0_4_;
      auVar15 = vshufps_avx(auVar18,auVar18,0x55);
      auVar126._0_4_ = fVar145 * fVar105 + fVar70 * auVar15._0_4_;
      auVar126._4_4_ = auVar159._4_4_ * fVar105 + auVar71._4_4_ * auVar15._4_4_;
      auVar126._8_4_ = auVar159._8_4_ * fVar105 + auVar71._8_4_ * auVar15._8_4_;
      auVar126._12_4_ = auVar159._12_4_ * fVar105 + auVar71._12_4_ * auVar15._12_4_;
      auVar200 = vsubps_avx(auVar200,auVar126);
      auVar15 = vandps_avx(local_4e0,auVar18);
      auVar18 = vshufps_avx(auVar15,auVar15,0xf5);
      auVar15 = vmaxss_avx(auVar18,auVar15);
    } while ((float)local_3d0._0_4_ <= auVar15._0_4_);
    local_120 = auVar200._0_4_;
    if ((0.0 <= local_120) && (local_120 <= 1.0)) {
      auVar15 = vmovshdup_avx(auVar200);
      fVar105 = auVar15._0_4_;
      if ((0.0 <= fVar105) && (fVar105 <= 1.0)) {
        auVar18 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]),
                                ZEXT416((uint)pre->ray_space[k].vy.field_0.m128[2]),0x1c);
        auVar289 = vinsertps_avx(auVar18,ZEXT416((uint)pre->ray_space[k].vz.field_0.m128[2]),0x28);
        auVar18 = vdpps_avx(auVar289,local_4f0,0x7f);
        auVar159 = vdpps_avx(auVar289,local_500,0x7f);
        auVar71 = vdpps_avx(auVar289,local_3e0,0x7f);
        auVar107 = vdpps_avx(auVar289,local_3f0,0x7f);
        auVar296 = vdpps_avx(auVar289,local_400,0x7f);
        auVar132 = vdpps_avx(auVar289,local_410,0x7f);
        auVar146 = vdpps_avx(auVar289,local_420,0x7f);
        auVar289 = vdpps_avx(auVar289,local_430,0x7f);
        fVar103 = 1.0 - fVar105;
        auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar105 * auVar296._0_4_)),ZEXT416((uint)fVar103),
                                  auVar18);
        auVar159 = vfmadd231ss_fma(ZEXT416((uint)(auVar132._0_4_ * fVar105)),ZEXT416((uint)fVar103),
                                   auVar159);
        auVar71 = vfmadd231ss_fma(ZEXT416((uint)(auVar146._0_4_ * fVar105)),ZEXT416((uint)fVar103),
                                  auVar71);
        auVar107 = vfmadd231ss_fma(ZEXT416((uint)(fVar105 * auVar289._0_4_)),ZEXT416((uint)fVar103),
                                   auVar107);
        fVar144 = 1.0 - local_120;
        fVar103 = fVar144 * local_120 * local_120 * 3.0;
        fVar166 = local_120 * local_120 * local_120;
        auVar71 = vfmadd231ss_fma(ZEXT416((uint)(fVar166 * auVar107._0_4_)),ZEXT416((uint)fVar103),
                                  auVar71);
        fVar145 = local_120 * 3.0 * fVar144 * fVar144;
        auVar159 = vfmadd231ss_fma(auVar71,ZEXT416((uint)fVar145),auVar159);
        fVar70 = fVar144 * fVar144 * fVar144;
        auVar18 = vfmadd231ss_fma(auVar159,ZEXT416((uint)fVar70),auVar18);
        fVar143 = auVar18._0_4_;
        if (((fVar69 <= fVar143) && (fVar167 = *(float *)(ray + k * 4 + 0x100), fVar143 <= fVar167))
           && (pGVar8 = (context->scene->geometries).items[uVar58].ptr,
              (pGVar8->mask & *(uint *)(ray + k * 4 + 0x120)) != 0)) {
          auVar18 = vshufps_avx(auVar200,auVar200,0x55);
          auVar273._8_4_ = 0x3f800000;
          auVar273._0_8_ = 0x3f8000003f800000;
          auVar273._12_4_ = 0x3f800000;
          auVar159 = vsubps_avx(auVar273,auVar18);
          fVar221 = auVar18._0_4_;
          auVar286._0_4_ = fVar221 * (float)local_530._0_4_;
          fVar237 = auVar18._4_4_;
          auVar286._4_4_ = fVar237 * (float)local_530._4_4_;
          fVar238 = auVar18._8_4_;
          auVar286._8_4_ = fVar238 * fStack_528;
          fVar239 = auVar18._12_4_;
          auVar286._12_4_ = fVar239 * fStack_524;
          local_5c0 = auVar114._0_4_;
          fStack_5bc = auVar114._4_4_;
          fStack_5b8 = auVar114._8_4_;
          fStack_5b4 = auVar114._12_4_;
          auVar292._0_4_ = fVar221 * local_5c0;
          auVar292._4_4_ = fVar237 * fStack_5bc;
          auVar292._8_4_ = fVar238 * fStack_5b8;
          auVar292._12_4_ = fVar239 * fStack_5b4;
          local_5d0 = auVar22._0_4_;
          fStack_5cc = auVar22._4_4_;
          fStack_5c8 = auVar22._8_4_;
          fStack_5c4 = auVar22._12_4_;
          auVar300._0_4_ = fVar221 * local_5d0;
          auVar300._4_4_ = fVar237 * fStack_5cc;
          auVar300._8_4_ = fVar238 * fStack_5c8;
          auVar300._12_4_ = fVar239 * fStack_5c4;
          local_5e0 = auVar133._0_4_;
          fStack_5dc = auVar133._4_4_;
          fStack_5d8 = auVar133._8_4_;
          fStack_5d4 = auVar133._12_4_;
          auVar255._0_4_ = fVar221 * local_5e0;
          auVar255._4_4_ = fVar237 * fStack_5dc;
          auVar255._8_4_ = fVar238 * fStack_5d8;
          auVar255._12_4_ = fVar239 * fStack_5d4;
          auVar18 = vfmadd231ps_fma(auVar286,auVar159,local_510);
          auVar71 = vfmadd231ps_fma(auVar292,auVar159,auVar17);
          auVar107 = vfmadd231ps_fma(auVar300,auVar159,local_520);
          auVar296 = vfmadd231ps_fma(auVar255,auVar159,auVar19);
          auVar18 = vsubps_avx(auVar71,auVar18);
          auVar159 = vsubps_avx(auVar107,auVar71);
          auVar71 = vsubps_avx(auVar296,auVar107);
          auVar301._0_4_ = local_120 * auVar159._0_4_;
          auVar301._4_4_ = local_120 * auVar159._4_4_;
          auVar301._8_4_ = local_120 * auVar159._8_4_;
          auVar301._12_4_ = local_120 * auVar159._12_4_;
          auVar232._4_4_ = fVar144;
          auVar232._0_4_ = fVar144;
          auVar232._8_4_ = fVar144;
          auVar232._12_4_ = fVar144;
          auVar18 = vfmadd231ps_fma(auVar301,auVar232,auVar18);
          auVar256._0_4_ = local_120 * auVar71._0_4_;
          auVar256._4_4_ = local_120 * auVar71._4_4_;
          auVar256._8_4_ = local_120 * auVar71._8_4_;
          auVar256._12_4_ = local_120 * auVar71._12_4_;
          auVar159 = vfmadd231ps_fma(auVar256,auVar232,auVar159);
          auVar257._0_4_ = local_120 * auVar159._0_4_;
          auVar257._4_4_ = local_120 * auVar159._4_4_;
          auVar257._8_4_ = local_120 * auVar159._8_4_;
          auVar257._12_4_ = local_120 * auVar159._12_4_;
          auVar159 = vfmadd231ps_fma(auVar257,auVar232,auVar18);
          auVar216._0_4_ = fVar166 * (float)local_480._0_4_;
          auVar216._4_4_ = fVar166 * (float)local_480._4_4_;
          auVar216._8_4_ = fVar166 * fStack_478;
          auVar216._12_4_ = fVar166 * fStack_474;
          auVar162._4_4_ = fVar103;
          auVar162._0_4_ = fVar103;
          auVar162._8_4_ = fVar103;
          auVar162._12_4_ = fVar103;
          auVar18 = vfmadd132ps_fma(auVar162,auVar216,local_470);
          auVar197._4_4_ = fVar145;
          auVar197._0_4_ = fVar145;
          auVar197._8_4_ = fVar145;
          auVar197._12_4_ = fVar145;
          auVar18 = vfmadd132ps_fma(auVar197,auVar18,local_460);
          auVar217._0_4_ = auVar159._0_4_ * 3.0;
          auVar217._4_4_ = auVar159._4_4_ * 3.0;
          auVar217._8_4_ = auVar159._8_4_ * 3.0;
          auVar217._12_4_ = auVar159._12_4_ * 3.0;
          auVar181._4_4_ = fVar70;
          auVar181._0_4_ = fVar70;
          auVar181._8_4_ = fVar70;
          auVar181._12_4_ = fVar70;
          auVar159 = vfmadd132ps_fma(auVar181,auVar18,local_450);
          auVar18 = vshufps_avx(auVar217,auVar217,0xc9);
          auVar163._0_4_ = auVar159._0_4_ * auVar18._0_4_;
          auVar163._4_4_ = auVar159._4_4_ * auVar18._4_4_;
          auVar163._8_4_ = auVar159._8_4_ * auVar18._8_4_;
          auVar163._12_4_ = auVar159._12_4_ * auVar18._12_4_;
          auVar18 = vshufps_avx(auVar159,auVar159,0xc9);
          auVar18 = vfmsub231ps_fma(auVar163,auVar217,auVar18);
          local_140 = auVar18._0_4_;
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
            *(float *)(ray + k * 4 + 0x100) = fVar143;
            uVar68 = vextractps_avx(auVar18,1);
            *(undefined4 *)(ray + k * 4 + 0x180) = uVar68;
            uVar68 = vextractps_avx(auVar18,2);
            *(undefined4 *)(ray + k * 4 + 0x1a0) = uVar68;
            *(undefined4 *)(ray + k * 4 + 0x1c0) = local_140;
            *(float *)(ray + k * 4 + 0x1e0) = local_120;
            *(float *)(ray + k * 4 + 0x200) = fVar105;
            *(uint *)(ray + k * 4 + 0x220) = uVar7;
            *(uint *)(ray + k * 4 + 0x240) = uVar58;
            *(uint *)(ray + k * 4 + 0x260) = context->user->instID[0];
            *(uint *)(ray + k * 4 + 0x280) = context->user->instPrimID[0];
            goto LAB_0129918a;
          }
          local_100 = auVar15._0_8_;
          auVar15 = vmovshdup_avx(auVar18);
          local_180 = auVar15._0_8_;
          auVar15 = vshufps_avx(auVar18,auVar18,0xaa);
          local_160 = auVar15._0_8_;
          uStack_178 = local_180;
          uStack_170 = local_180;
          uStack_168 = local_180;
          uStack_158 = local_160;
          uStack_150 = local_160;
          uStack_148 = local_160;
          uStack_13c = local_140;
          uStack_138 = local_140;
          uStack_134 = local_140;
          uStack_130 = local_140;
          uStack_12c = local_140;
          uStack_128 = local_140;
          uStack_124 = local_140;
          fStack_11c = local_120;
          fStack_118 = local_120;
          fStack_114 = local_120;
          fStack_110 = local_120;
          fStack_10c = local_120;
          fStack_108 = local_120;
          fStack_104 = local_120;
          uStack_f8 = local_100;
          uStack_f0 = local_100;
          uStack_e8 = local_100;
          local_e0 = CONCAT44(uStack_33c,local_340);
          uStack_d8 = CONCAT44(uStack_334,uStack_338);
          uStack_d0 = CONCAT44(uStack_32c,uStack_330);
          uStack_c8 = CONCAT44(uStack_324,uStack_328);
          local_c0._4_4_ = uStack_31c;
          local_c0._0_4_ = local_320;
          local_c0._8_4_ = uStack_318;
          local_c0._12_4_ = uStack_314;
          local_c0._16_4_ = uStack_310;
          local_c0._20_4_ = uStack_30c;
          local_c0._24_4_ = uStack_308;
          local_c0._28_4_ = uStack_304;
          vpcmpeqd_avx2(local_c0,local_c0);
          uStack_9c = context->user->instID[0];
          local_a0 = uStack_9c;
          uStack_98 = uStack_9c;
          uStack_94 = uStack_9c;
          uStack_90 = uStack_9c;
          uStack_8c = uStack_9c;
          uStack_88 = uStack_9c;
          uStack_84 = uStack_9c;
          uStack_7c = context->user->instPrimID[0];
          local_80 = uStack_7c;
          uStack_78 = uStack_7c;
          uStack_74 = uStack_7c;
          uStack_70 = uStack_7c;
          uStack_6c = uStack_7c;
          uStack_68 = uStack_7c;
          uStack_64 = uStack_7c;
          *(float *)(ray + k * 4 + 0x100) = fVar143;
          local_4c0 = local_360;
          local_560.valid = (int *)local_4c0;
          local_560.geometryUserPtr = pGVar8->userPtr;
          local_560.context = context->user;
          local_560.hit = (RTCHitN *)&local_180;
          local_560.N = 8;
          local_560.ray = (RTCRayN *)ray;
          if (pGVar8->intersectionFilterN != (RTCFilterFunctionN)0x0) {
            (*pGVar8->intersectionFilterN)(&local_560);
          }
          auVar98 = vpcmpeqd_avx2(local_4c0,_DAT_01f7b000);
          auVar98 = _DAT_01f7b020 & ~auVar98;
          if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar98 >> 0x7f,0) != '\0') ||
                (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar98 >> 0xbf,0) != '\0') ||
              (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar98[0x1f] < '\0') {
            p_Var14 = context->args->filter;
            if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar8->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var14)(&local_560);
            }
            auVar24 = vpcmpeqd_avx2(local_4c0,_DAT_01f7b000);
            auVar98 = _DAT_01f7b020 & ~auVar24;
            if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar98 >> 0x7f,0) != '\0') ||
                  (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar98 >> 0xbf,0) != '\0') ||
                (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar98[0x1f] < '\0') {
              auVar102._0_8_ = auVar24._0_8_ ^ 0xffffffffffffffff;
              auVar102._8_4_ = auVar24._8_4_ ^ 0xffffffff;
              auVar102._12_4_ = auVar24._12_4_ ^ 0xffffffff;
              auVar102._16_4_ = auVar24._16_4_ ^ 0xffffffff;
              auVar102._20_4_ = auVar24._20_4_ ^ 0xffffffff;
              auVar102._24_4_ = auVar24._24_4_ ^ 0xffffffff;
              auVar102._28_4_ = auVar24._28_4_ ^ 0xffffffff;
              auVar98 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])local_560.hit);
              *(undefined1 (*) [32])(local_560.ray + 0x180) = auVar98;
              auVar98 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_560.hit + 0x20));
              *(undefined1 (*) [32])(local_560.ray + 0x1a0) = auVar98;
              auVar98 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_560.hit + 0x40));
              *(undefined1 (*) [32])(local_560.ray + 0x1c0) = auVar98;
              auVar98 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_560.hit + 0x60));
              *(undefined1 (*) [32])(local_560.ray + 0x1e0) = auVar98;
              auVar98 = vmaskmovps_avx(auVar102,*(undefined1 (*) [32])(local_560.hit + 0x80));
              *(undefined1 (*) [32])(local_560.ray + 0x200) = auVar98;
              auVar98 = vpmaskmovd_avx2(auVar102,*(undefined1 (*) [32])(local_560.hit + 0xa0));
              *(undefined1 (*) [32])(local_560.ray + 0x220) = auVar98;
              auVar98 = vpmaskmovd_avx2(auVar102,*(undefined1 (*) [32])(local_560.hit + 0xc0));
              *(undefined1 (*) [32])(local_560.ray + 0x240) = auVar98;
              auVar98 = vpmaskmovd_avx2(auVar102,*(undefined1 (*) [32])(local_560.hit + 0xe0));
              *(undefined1 (*) [32])(local_560.ray + 0x260) = auVar98;
              auVar98 = vpmaskmovd_avx2(auVar102,*(undefined1 (*) [32])(local_560.hit + 0x100));
              *(undefined1 (*) [32])(local_560.ray + 0x280) = auVar98;
              goto LAB_0129918a;
            }
          }
          *(float *)(ray + k * 4 + 0x100) = fVar167;
        }
      }
    }
    goto LAB_0129918a;
  }
  local_440 = vinsertps_avx(auVar15,ZEXT416((uint)fVar103),0x10);
  auVar85 = vinsertps_avx(auVar222,ZEXT416((uint)auVar244._0_4_),0x10);
  goto LAB_01298bd9;
}

Assistant:

static __forceinline void intersect_n(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const Vec3fa ray_org(ray.org.x[k], ray.org.y[k], ray.org.z[k]);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray_org, primID,ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,curve,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }